

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  BBox1f BVar7;
  Primitive PVar8;
  uint uVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  void *pvVar12;
  __int_type_conflict _Var13;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  uint uVar57;
  uint uVar58;
  long lVar59;
  uint uVar60;
  ulong uVar61;
  ulong uVar62;
  float fVar63;
  float fVar92;
  float fVar93;
  vint4 bi_2;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar94;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar69 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar100 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 extraout_var [56];
  vint4 ai;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float t1;
  float fVar145;
  float fVar156;
  float fVar157;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar158;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  vint4 bi;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar176;
  float fVar192;
  float fVar193;
  vint4 ai_2;
  undefined1 auVar177 [16];
  float fVar194;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar195;
  float fVar210;
  float fVar211;
  vint4 ai_1;
  undefined1 auVar196 [16];
  float fVar212;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  vfloat4 b0;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar232;
  undefined1 auVar231 [32];
  float fVar233;
  float fVar246;
  float fVar247;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar244 [32];
  float fVar248;
  undefined1 auVar245 [32];
  float fVar252;
  float fVar259;
  float fVar260;
  __m128 a;
  float fVar261;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  float fVar262;
  float fVar271;
  float fVar272;
  vfloat4 a0_1;
  float fVar273;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  float fVar274;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar282;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  float fVar293;
  float fVar294;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar300 [64];
  float fVar308;
  vfloat4 a0;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [64];
  vfloat_impl<4> p00;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float fStack_560;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  undefined1 local_488 [16];
  undefined1 (*local_470) [16];
  RTCFilterFunctionNArguments args;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  uint mask_stack [4];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  vfloat_impl<4> p03;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  BBox1f cu_stack [4];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar209 [32];
  undefined1 auVar299 [32];
  
  PVar8 = prim[1];
  uVar62 = (ulong)(byte)PVar8;
  auVar219 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar219 = vinsertps_avx(auVar219,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar201 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar201 = vinsertps_avx(auVar201,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar219 = vsubps_avx(auVar219,*(undefined1 (*) [16])(prim + uVar62 * 0x19 + 6));
  fVar176 = *(float *)(prim + uVar62 * 0x19 + 0x12);
  auVar95._0_4_ = fVar176 * auVar219._0_4_;
  auVar95._4_4_ = fVar176 * auVar219._4_4_;
  auVar95._8_4_ = fVar176 * auVar219._8_4_;
  auVar95._12_4_ = fVar176 * auVar219._12_4_;
  auVar219 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar213._0_4_ = fVar176 * auVar201._0_4_;
  auVar213._4_4_ = fVar176 * auVar201._4_4_;
  auVar213._8_4_ = fVar176 * auVar201._8_4_;
  auVar213._12_4_ = fVar176 * auVar201._12_4_;
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar265 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xc + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xd + 6)));
  auVar265 = vcvtdq2ps_avx(auVar265);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x12 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x13 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x14 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar64 = vshufps_avx(auVar213,auVar213,0);
  auVar96 = vshufps_avx(auVar213,auVar213,0x55);
  auVar120 = vshufps_avx(auVar213,auVar213,0xaa);
  fVar176 = auVar120._0_4_;
  fVar145 = auVar120._4_4_;
  fVar192 = auVar120._8_4_;
  fVar156 = auVar120._12_4_;
  fVar195 = auVar96._0_4_;
  fVar210 = auVar96._4_4_;
  fVar211 = auVar96._8_4_;
  fVar212 = auVar96._12_4_;
  fVar193 = auVar64._0_4_;
  fVar157 = auVar64._4_4_;
  fVar194 = auVar64._8_4_;
  fVar158 = auVar64._12_4_;
  auVar142._0_4_ = fVar193 * auVar219._0_4_ + fVar195 * auVar201._0_4_ + fVar176 * auVar16._0_4_;
  auVar142._4_4_ = fVar157 * auVar219._4_4_ + fVar210 * auVar201._4_4_ + fVar145 * auVar16._4_4_;
  auVar142._8_4_ = fVar194 * auVar219._8_4_ + fVar211 * auVar201._8_4_ + fVar192 * auVar16._8_4_;
  auVar142._12_4_ = fVar158 * auVar219._12_4_ + fVar212 * auVar201._12_4_ + fVar156 * auVar16._12_4_
  ;
  auVar113._0_4_ = fVar193 * auVar17._0_4_ + fVar195 * auVar265._0_4_ + auVar18._0_4_ * fVar176;
  auVar113._4_4_ = fVar157 * auVar17._4_4_ + fVar210 * auVar265._4_4_ + auVar18._4_4_ * fVar145;
  auVar113._8_4_ = fVar194 * auVar17._8_4_ + fVar211 * auVar265._8_4_ + auVar18._8_4_ * fVar192;
  auVar113._12_4_ = fVar158 * auVar17._12_4_ + fVar212 * auVar265._12_4_ + auVar18._12_4_ * fVar156;
  auVar214._0_4_ = fVar193 * auVar65._0_4_ + fVar195 * auVar66._0_4_ + auVar97._0_4_ * fVar176;
  auVar214._4_4_ = fVar157 * auVar65._4_4_ + fVar210 * auVar66._4_4_ + auVar97._4_4_ * fVar145;
  auVar214._8_4_ = fVar194 * auVar65._8_4_ + fVar211 * auVar66._8_4_ + auVar97._8_4_ * fVar192;
  auVar214._12_4_ = fVar158 * auVar65._12_4_ + fVar212 * auVar66._12_4_ + auVar97._12_4_ * fVar156;
  auVar64 = vshufps_avx(auVar95,auVar95,0);
  auVar96 = vshufps_avx(auVar95,auVar95,0x55);
  auVar120 = vshufps_avx(auVar95,auVar95,0xaa);
  fVar176 = auVar120._0_4_;
  fVar145 = auVar120._4_4_;
  fVar192 = auVar120._8_4_;
  fVar156 = auVar120._12_4_;
  fVar195 = auVar96._0_4_;
  fVar210 = auVar96._4_4_;
  fVar211 = auVar96._8_4_;
  fVar212 = auVar96._12_4_;
  fVar193 = auVar64._0_4_;
  fVar157 = auVar64._4_4_;
  fVar194 = auVar64._8_4_;
  fVar158 = auVar64._12_4_;
  auVar159._0_4_ = fVar193 * auVar219._0_4_ + fVar195 * auVar201._0_4_ + fVar176 * auVar16._0_4_;
  auVar159._4_4_ = fVar157 * auVar219._4_4_ + fVar210 * auVar201._4_4_ + fVar145 * auVar16._4_4_;
  auVar159._8_4_ = fVar194 * auVar219._8_4_ + fVar211 * auVar201._8_4_ + fVar192 * auVar16._8_4_;
  auVar159._12_4_ = fVar158 * auVar219._12_4_ + fVar212 * auVar201._12_4_ + fVar156 * auVar16._12_4_
  ;
  auVar96._0_4_ = fVar193 * auVar17._0_4_ + auVar18._0_4_ * fVar176 + fVar195 * auVar265._0_4_;
  auVar96._4_4_ = fVar157 * auVar17._4_4_ + auVar18._4_4_ * fVar145 + fVar210 * auVar265._4_4_;
  auVar96._8_4_ = fVar194 * auVar17._8_4_ + auVar18._8_4_ * fVar192 + fVar211 * auVar265._8_4_;
  auVar96._12_4_ = fVar158 * auVar17._12_4_ + auVar18._12_4_ * fVar156 + fVar212 * auVar265._12_4_;
  auVar64._0_4_ = fVar195 * auVar66._0_4_ + auVar97._0_4_ * fVar176 + fVar193 * auVar65._0_4_;
  auVar64._4_4_ = fVar210 * auVar66._4_4_ + auVar97._4_4_ * fVar145 + fVar157 * auVar65._4_4_;
  auVar64._8_4_ = fVar211 * auVar66._8_4_ + auVar97._8_4_ * fVar192 + fVar194 * auVar65._8_4_;
  auVar64._12_4_ = fVar212 * auVar66._12_4_ + auVar97._12_4_ * fVar156 + fVar158 * auVar65._12_4_;
  auVar196._8_4_ = 0x7fffffff;
  auVar196._0_8_ = 0x7fffffff7fffffff;
  auVar196._12_4_ = 0x7fffffff;
  auVar219 = vandps_avx(auVar142,auVar196);
  auVar146._8_4_ = 0x219392ef;
  auVar146._0_8_ = 0x219392ef219392ef;
  auVar146._12_4_ = 0x219392ef;
  auVar219 = vcmpps_avx(auVar219,auVar146,1);
  auVar201 = vblendvps_avx(auVar142,auVar146,auVar219);
  auVar219 = vandps_avx(auVar113,auVar196);
  auVar219 = vcmpps_avx(auVar219,auVar146,1);
  auVar16 = vblendvps_avx(auVar113,auVar146,auVar219);
  auVar219 = vandps_avx(auVar214,auVar196);
  auVar219 = vcmpps_avx(auVar219,auVar146,1);
  auVar219 = vblendvps_avx(auVar214,auVar146,auVar219);
  auVar17 = vrcpps_avx(auVar201);
  fVar195 = auVar17._0_4_;
  auVar120._0_4_ = fVar195 * auVar201._0_4_;
  fVar210 = auVar17._4_4_;
  auVar120._4_4_ = fVar210 * auVar201._4_4_;
  fVar211 = auVar17._8_4_;
  auVar120._8_4_ = fVar211 * auVar201._8_4_;
  fVar212 = auVar17._12_4_;
  auVar120._12_4_ = fVar212 * auVar201._12_4_;
  auVar73._8_4_ = 0x3f800000;
  auVar73._0_8_ = 0x3f8000003f800000;
  auVar73._12_4_ = 0x3f800000;
  auVar201 = vsubps_avx(auVar73,auVar120);
  fVar195 = fVar195 + fVar195 * auVar201._0_4_;
  fVar210 = fVar210 + fVar210 * auVar201._4_4_;
  fVar211 = fVar211 + fVar211 * auVar201._8_4_;
  fVar212 = fVar212 + fVar212 * auVar201._12_4_;
  auVar201 = vrcpps_avx(auVar16);
  fVar176 = auVar201._0_4_;
  auVar177._0_4_ = fVar176 * auVar16._0_4_;
  fVar192 = auVar201._4_4_;
  auVar177._4_4_ = fVar192 * auVar16._4_4_;
  fVar193 = auVar201._8_4_;
  auVar177._8_4_ = fVar193 * auVar16._8_4_;
  fVar194 = auVar201._12_4_;
  auVar177._12_4_ = fVar194 * auVar16._12_4_;
  auVar201 = vsubps_avx(auVar73,auVar177);
  fVar176 = fVar176 + fVar176 * auVar201._0_4_;
  fVar192 = fVar192 + fVar192 * auVar201._4_4_;
  fVar193 = fVar193 + fVar193 * auVar201._8_4_;
  fVar194 = fVar194 + fVar194 * auVar201._12_4_;
  auVar201 = vrcpps_avx(auVar219);
  fVar145 = auVar201._0_4_;
  auVar147._0_4_ = fVar145 * auVar219._0_4_;
  fVar156 = auVar201._4_4_;
  auVar147._4_4_ = fVar156 * auVar219._4_4_;
  fVar157 = auVar201._8_4_;
  auVar147._8_4_ = fVar157 * auVar219._8_4_;
  fVar158 = auVar201._12_4_;
  auVar147._12_4_ = fVar158 * auVar219._12_4_;
  auVar219 = vsubps_avx(auVar73,auVar147);
  fVar145 = fVar145 + fVar145 * auVar219._0_4_;
  fVar156 = fVar156 + fVar156 * auVar219._4_4_;
  fVar157 = fVar157 + fVar157 * auVar219._8_4_;
  fVar158 = fVar158 + fVar158 * auVar219._12_4_;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar219 = vpmovsxwd_avx(auVar219);
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar16 = vsubps_avx(auVar219,auVar159);
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar219 = vpmovsxwd_avx(auVar201);
  auVar121._0_4_ = fVar195 * auVar16._0_4_;
  auVar121._4_4_ = fVar210 * auVar16._4_4_;
  auVar121._8_4_ = fVar211 * auVar16._8_4_;
  auVar121._12_4_ = fVar212 * auVar16._12_4_;
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar219 = vsubps_avx(auVar219,auVar159);
  auVar160._0_4_ = fVar195 * auVar219._0_4_;
  auVar160._4_4_ = fVar210 * auVar219._4_4_;
  auVar160._8_4_ = fVar211 * auVar219._8_4_;
  auVar160._12_4_ = fVar212 * auVar219._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar62 * 0xe + 6);
  auVar219 = vpmovsxwd_avx(auVar16);
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar201 = vsubps_avx(auVar219,auVar96);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar219 = vpmovsxwd_avx(auVar17);
  auVar197._0_4_ = auVar201._0_4_ * fVar176;
  auVar197._4_4_ = auVar201._4_4_ * fVar192;
  auVar197._8_4_ = auVar201._8_4_ * fVar193;
  auVar197._12_4_ = auVar201._12_4_ * fVar194;
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar219 = vsubps_avx(auVar219,auVar96);
  auVar97._0_4_ = fVar176 * auVar219._0_4_;
  auVar97._4_4_ = fVar192 * auVar219._4_4_;
  auVar97._8_4_ = fVar193 * auVar219._8_4_;
  auVar97._12_4_ = fVar194 * auVar219._12_4_;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = *(ulong *)(prim + uVar62 * 0x15 + 6);
  auVar219 = vpmovsxwd_avx(auVar265);
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar219 = vsubps_avx(auVar219,auVar64);
  auVar178._0_4_ = auVar219._0_4_ * fVar145;
  auVar178._4_4_ = auVar219._4_4_ * fVar156;
  auVar178._8_4_ = auVar219._8_4_ * fVar157;
  auVar178._12_4_ = auVar219._12_4_ * fVar158;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar62 * 0x17 + 6);
  auVar219 = vpmovsxwd_avx(auVar18);
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar219 = vsubps_avx(auVar219,auVar64);
  auVar65._0_4_ = auVar219._0_4_ * fVar145;
  auVar65._4_4_ = auVar219._4_4_ * fVar156;
  auVar65._8_4_ = auVar219._8_4_ * fVar157;
  auVar65._12_4_ = auVar219._12_4_ * fVar158;
  auVar219 = vpminsd_avx(auVar121,auVar160);
  auVar201 = vpminsd_avx(auVar197,auVar97);
  auVar219 = vmaxps_avx(auVar219,auVar201);
  auVar201 = vpminsd_avx(auVar178,auVar65);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar234._4_4_ = uVar6;
  auVar234._0_4_ = uVar6;
  auVar234._8_4_ = uVar6;
  auVar234._12_4_ = uVar6;
  auVar201 = vmaxps_avx(auVar201,auVar234);
  auVar219 = vmaxps_avx(auVar219,auVar201);
  auVar148._0_4_ = auVar219._0_4_ * 0.99999964;
  auVar148._4_4_ = auVar219._4_4_ * 0.99999964;
  auVar148._8_4_ = auVar219._8_4_ * 0.99999964;
  auVar148._12_4_ = auVar219._12_4_ * 0.99999964;
  auVar219 = vpmaxsd_avx(auVar121,auVar160);
  auVar201 = vpmaxsd_avx(auVar197,auVar97);
  auVar219 = vminps_avx(auVar219,auVar201);
  auVar201 = vpmaxsd_avx(auVar178,auVar65);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar122._4_4_ = uVar6;
  auVar122._0_4_ = uVar6;
  auVar122._8_4_ = uVar6;
  auVar122._12_4_ = uVar6;
  auVar201 = vminps_avx(auVar201,auVar122);
  auVar219 = vminps_avx(auVar219,auVar201);
  auVar66._0_4_ = auVar219._0_4_ * 1.0000004;
  auVar66._4_4_ = auVar219._4_4_ * 1.0000004;
  auVar66._8_4_ = auVar219._8_4_ * 1.0000004;
  auVar66._12_4_ = auVar219._12_4_ * 1.0000004;
  auVar219 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar201 = vpcmpgtd_avx(auVar219,_DAT_01f4ad30);
  auVar219 = vcmpps_avx(auVar148,auVar66,2);
  auVar219 = vandps_avx(auVar219,auVar201);
  uVar57 = vmovmskps_avx(auVar219);
  auVar86._16_16_ = mm_lookupmask_ps._240_16_;
  auVar86._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar86,ZEXT832(0) << 0x20,0x80);
  local_470 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
LAB_0079f8d8:
  uVar62 = (ulong)uVar57;
  if (uVar62 == 0) {
    return;
  }
  lVar59 = 0;
  if (uVar62 != 0) {
    for (; (uVar57 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
    }
  }
  uVar57 = *(uint *)(prim + 2);
  uVar9 = *(uint *)(prim + lVar59 * 4 + 6);
  pGVar10 = (context->scene->geometries).items[uVar57].ptr;
  uVar61 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar9);
  p_Var11 = pGVar10[1].intersectionFilterN;
  pvVar12 = pGVar10[2].userPtr;
  _Var13 = pGVar10[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar3 = (float *)(_Var13 + uVar61 * (long)pvVar12);
  fVar176 = *pfVar3;
  fVar145 = pfVar3[1];
  fVar192 = pfVar3[2];
  fVar156 = pfVar3[3];
  pfVar4 = (float *)(_Var13 + (uVar61 + 1) * (long)pvVar12);
  pfVar5 = (float *)(_Var13 + (uVar61 + 2) * (long)pvVar12);
  pfVar3 = (float *)(_Var13 + (long)pvVar12 * (uVar61 + 3));
  fVar193 = *pfVar3;
  fVar157 = pfVar3[1];
  fVar194 = pfVar3[2];
  fVar158 = pfVar3[3];
  uVar62 = uVar62 - 1 & uVar62;
  lVar59 = *(long *)&pGVar10[1].time_range.upper;
  pfVar3 = (float *)(lVar59 + (long)p_Var11 * uVar61);
  fVar195 = *pfVar3;
  fVar210 = pfVar3[1];
  fVar211 = pfVar3[2];
  fVar212 = pfVar3[3];
  pfVar3 = (float *)(lVar59 + (long)p_Var11 * (uVar61 + 1));
  pfVar1 = (float *)(lVar59 + (long)p_Var11 * (uVar61 + 2));
  lVar14 = 0;
  if (uVar62 != 0) {
    for (; (uVar62 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
    }
  }
  pfVar2 = (float *)(lVar59 + (long)p_Var11 * (uVar61 + 3));
  fVar63 = *pfVar2;
  fVar92 = pfVar2[1];
  fVar93 = pfVar2[2];
  fVar94 = pfVar2[3];
  if (((uVar62 != 0) && (uVar61 = uVar62 - 1 & uVar62, uVar61 != 0)) && (lVar59 = 0, uVar61 != 0)) {
    for (; (uVar61 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
    }
  }
  auVar219 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar16 = vinsertps_avx(auVar219,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar252 = *pfVar1 * 0.0;
  fVar259 = pfVar1[1] * 0.0;
  fVar260 = pfVar1[2] * 0.0;
  fVar261 = pfVar1[3] * 0.0;
  fVar262 = fVar252 + fVar63 * 0.0;
  fVar271 = fVar259 + fVar92 * 0.0;
  fVar272 = fVar260 + fVar93 * 0.0;
  fVar273 = fVar261 + fVar94 * 0.0;
  fVar274 = *pfVar3 * 0.0;
  fVar279 = pfVar3[1] * 0.0;
  fVar280 = pfVar3[2] * 0.0;
  fVar281 = pfVar3[3] * 0.0;
  local_5b8._0_4_ = fVar195 + fVar274 + fVar262;
  local_5b8._4_4_ = fVar210 + fVar279 + fVar271;
  fStack_5b0 = fVar211 + fVar280 + fVar272;
  fStack_5ac = fVar212 + fVar281 + fVar273;
  auVar123._0_4_ = fVar262 + *pfVar3 * 3.0;
  auVar123._4_4_ = fVar271 + pfVar3[1] * 3.0;
  auVar123._8_4_ = fVar272 + pfVar3[2] * 3.0;
  auVar123._12_4_ = fVar273 + pfVar3[3] * 3.0;
  auVar263._0_4_ = fVar195 * 3.0;
  auVar263._4_4_ = fVar210 * 3.0;
  auVar263._8_4_ = fVar211 * 3.0;
  auVar263._12_4_ = fVar212 * 3.0;
  auVar97 = vsubps_avx(auVar123,auVar263);
  fVar287 = *pfVar5 * 0.0;
  fVar290 = pfVar5[1] * 0.0;
  fVar291 = pfVar5[2] * 0.0;
  fVar292 = pfVar5[3] * 0.0;
  fVar262 = fVar287 + fVar193 * 0.0;
  fVar271 = fVar290 + fVar157 * 0.0;
  fVar272 = fVar291 + fVar194 * 0.0;
  fVar273 = fVar292 + fVar158 * 0.0;
  fVar294 = *pfVar4 * 0.0;
  fVar301 = pfVar4[1] * 0.0;
  fVar302 = pfVar4[2] * 0.0;
  fVar303 = pfVar4[3] * 0.0;
  auVar304._0_4_ = fVar294 + fVar262 + fVar176;
  auVar304._4_4_ = fVar301 + fVar271 + fVar145;
  auVar304._8_4_ = fVar302 + fVar272 + fVar192;
  auVar304._12_4_ = fVar303 + fVar273 + fVar156;
  auVar149._0_4_ = fVar262 + *pfVar4 * 3.0;
  auVar149._4_4_ = fVar271 + pfVar4[1] * 3.0;
  auVar149._8_4_ = fVar272 + pfVar4[2] * 3.0;
  auVar149._12_4_ = fVar273 + pfVar4[3] * 3.0;
  auVar264._0_4_ = fVar176 * 3.0;
  auVar264._4_4_ = fVar145 * 3.0;
  auVar264._8_4_ = fVar192 * 3.0;
  auVar264._12_4_ = fVar156 * 3.0;
  auVar265 = vsubps_avx(auVar149,auVar264);
  auVar225._0_4_ = fVar195 * 0.0;
  auVar225._4_4_ = fVar210 * 0.0;
  auVar225._8_4_ = fVar211 * 0.0;
  auVar225._12_4_ = fVar212 * 0.0;
  auVar150._0_4_ = auVar225._0_4_ + fVar274 + fVar252 + fVar63;
  auVar150._4_4_ = auVar225._4_4_ + fVar279 + fVar259 + fVar92;
  auVar150._8_4_ = auVar225._8_4_ + fVar280 + fVar260 + fVar93;
  auVar150._12_4_ = auVar225._12_4_ + fVar281 + fVar261 + fVar94;
  auVar235._0_4_ = fVar63 * 3.0;
  auVar235._4_4_ = fVar92 * 3.0;
  auVar235._8_4_ = fVar93 * 3.0;
  auVar235._12_4_ = fVar94 * 3.0;
  auVar161._0_4_ = *pfVar1 * 3.0;
  auVar161._4_4_ = pfVar1[1] * 3.0;
  auVar161._8_4_ = pfVar1[2] * 3.0;
  auVar161._12_4_ = pfVar1[3] * 3.0;
  auVar219 = vsubps_avx(auVar235,auVar161);
  auVar162._0_4_ = fVar274 + auVar219._0_4_;
  auVar162._4_4_ = fVar279 + auVar219._4_4_;
  auVar162._8_4_ = fVar280 + auVar219._8_4_;
  auVar162._12_4_ = fVar281 + auVar219._12_4_;
  auVar64 = vsubps_avx(auVar162,auVar225);
  auVar179._0_4_ = fVar176 * 0.0;
  auVar179._4_4_ = fVar145 * 0.0;
  auVar179._8_4_ = fVar192 * 0.0;
  auVar179._12_4_ = fVar156 * 0.0;
  auVar236._0_4_ = fVar294 + fVar287 + fVar193 + auVar179._0_4_;
  auVar236._4_4_ = fVar301 + fVar290 + fVar157 + auVar179._4_4_;
  auVar236._8_4_ = fVar302 + fVar291 + fVar194 + auVar179._8_4_;
  auVar236._12_4_ = fVar303 + fVar292 + fVar158 + auVar179._12_4_;
  auVar215._0_4_ = fVar193 * 3.0;
  auVar215._4_4_ = fVar157 * 3.0;
  auVar215._8_4_ = fVar194 * 3.0;
  auVar215._12_4_ = fVar158 * 3.0;
  auVar198._0_4_ = *pfVar5 * 3.0;
  auVar198._4_4_ = pfVar5[1] * 3.0;
  auVar198._8_4_ = pfVar5[2] * 3.0;
  auVar198._12_4_ = pfVar5[3] * 3.0;
  auVar219 = vsubps_avx(auVar215,auVar198);
  auVar199._0_4_ = fVar294 + auVar219._0_4_;
  auVar199._4_4_ = fVar301 + auVar219._4_4_;
  auVar199._8_4_ = fVar302 + auVar219._8_4_;
  auVar199._12_4_ = fVar303 + auVar219._12_4_;
  auVar65 = vsubps_avx(auVar199,auVar179);
  auVar219 = vshufps_avx(auVar97,auVar97,0xc9);
  auVar201 = vshufps_avx(auVar304,auVar304,0xc9);
  fVar262 = auVar97._0_4_;
  auVar216._0_4_ = fVar262 * auVar201._0_4_;
  fVar271 = auVar97._4_4_;
  auVar216._4_4_ = fVar271 * auVar201._4_4_;
  fVar272 = auVar97._8_4_;
  auVar216._8_4_ = fVar272 * auVar201._8_4_;
  fVar273 = auVar97._12_4_;
  auVar216._12_4_ = fVar273 * auVar201._12_4_;
  auVar226._0_4_ = auVar304._0_4_ * auVar219._0_4_;
  auVar226._4_4_ = auVar304._4_4_ * auVar219._4_4_;
  auVar226._8_4_ = auVar304._8_4_ * auVar219._8_4_;
  auVar226._12_4_ = auVar304._12_4_ * auVar219._12_4_;
  auVar201 = vsubps_avx(auVar226,auVar216);
  auVar17 = vshufps_avx(auVar201,auVar201,0xc9);
  auVar201 = vshufps_avx(auVar265,auVar265,0xc9);
  auVar217._0_4_ = fVar262 * auVar201._0_4_;
  auVar217._4_4_ = fVar271 * auVar201._4_4_;
  auVar217._8_4_ = fVar272 * auVar201._8_4_;
  auVar217._12_4_ = fVar273 * auVar201._12_4_;
  auVar180._0_4_ = auVar265._0_4_ * auVar219._0_4_;
  auVar180._4_4_ = auVar265._4_4_ * auVar219._4_4_;
  auVar180._8_4_ = auVar265._8_4_ * auVar219._8_4_;
  auVar180._12_4_ = auVar265._12_4_ * auVar219._12_4_;
  auVar219 = vsubps_avx(auVar180,auVar217);
  auVar265 = vshufps_avx(auVar219,auVar219,0xc9);
  auVar219 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar201 = vshufps_avx(auVar236,auVar236,0xc9);
  fVar274 = auVar64._0_4_;
  auVar181._0_4_ = fVar274 * auVar201._0_4_;
  fVar279 = auVar64._4_4_;
  auVar181._4_4_ = fVar279 * auVar201._4_4_;
  fVar280 = auVar64._8_4_;
  auVar181._8_4_ = fVar280 * auVar201._8_4_;
  fVar281 = auVar64._12_4_;
  auVar181._12_4_ = fVar281 * auVar201._12_4_;
  auVar237._0_4_ = auVar236._0_4_ * auVar219._0_4_;
  auVar237._4_4_ = auVar236._4_4_ * auVar219._4_4_;
  auVar237._8_4_ = auVar236._8_4_ * auVar219._8_4_;
  auVar237._12_4_ = auVar236._12_4_ * auVar219._12_4_;
  auVar201 = vsubps_avx(auVar237,auVar181);
  auVar18 = vshufps_avx(auVar201,auVar201,0xc9);
  auVar201 = vshufps_avx(auVar65,auVar65,0xc9);
  auVar238._0_4_ = auVar201._0_4_ * fVar274;
  auVar238._4_4_ = auVar201._4_4_ * fVar279;
  auVar238._8_4_ = auVar201._8_4_ * fVar280;
  auVar238._12_4_ = auVar201._12_4_ * fVar281;
  auVar200._0_4_ = auVar219._0_4_ * auVar65._0_4_;
  auVar200._4_4_ = auVar219._4_4_ * auVar65._4_4_;
  auVar200._8_4_ = auVar219._8_4_ * auVar65._8_4_;
  auVar200._12_4_ = auVar219._12_4_ * auVar65._12_4_;
  auVar219 = vdpps_avx(auVar17,auVar17,0x7f);
  auVar201 = vsubps_avx(auVar200,auVar238);
  auVar65 = vshufps_avx(auVar201,auVar201,0xc9);
  fVar193 = auVar219._0_4_;
  auVar120 = ZEXT416((uint)fVar193);
  auVar201 = vrsqrtss_avx(auVar120,auVar120);
  fVar176 = auVar201._0_4_;
  auVar201 = ZEXT416((uint)(fVar176 * 1.5 - fVar193 * 0.5 * fVar176 * fVar176 * fVar176));
  auVar66 = vshufps_avx(auVar201,auVar201,0);
  fVar176 = auVar17._0_4_ * auVar66._0_4_;
  fVar145 = auVar17._4_4_ * auVar66._4_4_;
  fVar192 = auVar17._8_4_ * auVar66._8_4_;
  fVar156 = auVar17._12_4_ * auVar66._12_4_;
  auVar201 = vdpps_avx(auVar17,auVar265,0x7f);
  auVar219 = vshufps_avx(auVar219,auVar219,0);
  auVar253._0_4_ = auVar265._0_4_ * auVar219._0_4_;
  auVar253._4_4_ = auVar265._4_4_ * auVar219._4_4_;
  auVar253._8_4_ = auVar265._8_4_ * auVar219._8_4_;
  auVar253._12_4_ = auVar265._12_4_ * auVar219._12_4_;
  auVar219 = vshufps_avx(auVar201,auVar201,0);
  auVar227._0_4_ = auVar17._0_4_ * auVar219._0_4_;
  auVar227._4_4_ = auVar17._4_4_ * auVar219._4_4_;
  auVar227._8_4_ = auVar17._8_4_ * auVar219._8_4_;
  auVar227._12_4_ = auVar17._12_4_ * auVar219._12_4_;
  auVar96 = vsubps_avx(auVar253,auVar227);
  auVar219 = vrcpss_avx(auVar120,auVar120);
  auVar219 = ZEXT416((uint)(auVar219._0_4_ * (2.0 - fVar193 * auVar219._0_4_)));
  auVar17 = vshufps_avx(auVar219,auVar219,0);
  auVar219 = vdpps_avx(auVar18,auVar18,0x7f);
  fVar193 = auVar219._0_4_;
  auVar120 = ZEXT416((uint)fVar193);
  auVar201 = vrsqrtss_avx(auVar120,auVar120);
  fVar157 = auVar201._0_4_;
  auVar201 = vdpps_avx(auVar18,auVar65,0x7f);
  auVar265 = ZEXT416((uint)(fVar157 * 1.5 - fVar193 * 0.5 * fVar157 * fVar157 * fVar157));
  auVar265 = vshufps_avx(auVar265,auVar265,0);
  fVar157 = auVar265._0_4_ * auVar18._0_4_;
  fVar194 = auVar265._4_4_ * auVar18._4_4_;
  fVar158 = auVar265._8_4_ * auVar18._8_4_;
  fVar195 = auVar265._12_4_ * auVar18._12_4_;
  auVar219 = vshufps_avx(auVar219,auVar219,0);
  auVar218._0_4_ = auVar219._0_4_ * auVar65._0_4_;
  auVar218._4_4_ = auVar219._4_4_ * auVar65._4_4_;
  auVar218._8_4_ = auVar219._8_4_ * auVar65._8_4_;
  auVar218._12_4_ = auVar219._12_4_ * auVar65._12_4_;
  auVar219 = vshufps_avx(auVar201,auVar201,0);
  auVar182._0_4_ = auVar219._0_4_ * auVar18._0_4_;
  auVar182._4_4_ = auVar219._4_4_ * auVar18._4_4_;
  auVar182._8_4_ = auVar219._8_4_ * auVar18._8_4_;
  auVar182._12_4_ = auVar219._12_4_ * auVar18._12_4_;
  auVar65 = vsubps_avx(auVar218,auVar182);
  auVar219 = vrcpss_avx(auVar120,auVar120);
  auVar219 = ZEXT416((uint)((2.0 - fVar193 * auVar219._0_4_) * auVar219._0_4_));
  auVar219 = vshufps_avx(auVar219,auVar219,0);
  auVar201 = vshufps_avx(_local_5b8,_local_5b8,0xff);
  auVar239._0_4_ = auVar201._0_4_ * fVar176;
  auVar239._4_4_ = auVar201._4_4_ * fVar145;
  auVar239._8_4_ = auVar201._8_4_ * fVar192;
  auVar239._12_4_ = auVar201._12_4_ * fVar156;
  auVar120 = vsubps_avx(_local_5b8,auVar239);
  auVar18 = vshufps_avx(auVar97,auVar97,0xff);
  auVar202._0_4_ =
       auVar18._0_4_ * fVar176 + auVar66._0_4_ * auVar96._0_4_ * auVar17._0_4_ * auVar201._0_4_;
  auVar202._4_4_ =
       auVar18._4_4_ * fVar145 + auVar66._4_4_ * auVar96._4_4_ * auVar17._4_4_ * auVar201._4_4_;
  auVar202._8_4_ =
       auVar18._8_4_ * fVar192 + auVar66._8_4_ * auVar96._8_4_ * auVar17._8_4_ * auVar201._8_4_;
  auVar202._12_4_ =
       auVar18._12_4_ * fVar156 + auVar66._12_4_ * auVar96._12_4_ * auVar17._12_4_ * auVar201._12_4_
  ;
  auVar18 = vsubps_avx(auVar97,auVar202);
  auVar275._0_4_ = auVar239._0_4_ + (float)local_5b8._0_4_;
  auVar275._4_4_ = auVar239._4_4_ + (float)local_5b8._4_4_;
  auVar275._8_4_ = auVar239._8_4_ + fStack_5b0;
  auVar275._12_4_ = auVar239._12_4_ + fStack_5ac;
  auVar201 = vshufps_avx(auVar150,auVar150,0xff);
  auVar124._0_4_ = fVar157 * auVar201._0_4_;
  auVar124._4_4_ = fVar194 * auVar201._4_4_;
  auVar124._8_4_ = fVar158 * auVar201._8_4_;
  auVar124._12_4_ = fVar195 * auVar201._12_4_;
  auVar66 = vsubps_avx(auVar150,auVar124);
  auVar17 = vshufps_avx(auVar64,auVar64,0xff);
  auVar98._0_4_ =
       fVar157 * auVar17._0_4_ + auVar201._0_4_ * auVar265._0_4_ * auVar65._0_4_ * auVar219._0_4_;
  auVar98._4_4_ =
       fVar194 * auVar17._4_4_ + auVar201._4_4_ * auVar265._4_4_ * auVar65._4_4_ * auVar219._4_4_;
  auVar98._8_4_ =
       fVar158 * auVar17._8_4_ + auVar201._8_4_ * auVar265._8_4_ * auVar65._8_4_ * auVar219._8_4_;
  auVar98._12_4_ =
       fVar195 * auVar17._12_4_ +
       auVar201._12_4_ * auVar265._12_4_ * auVar65._12_4_ * auVar219._12_4_;
  auVar265 = vsubps_avx(auVar64,auVar98);
  fVar63 = auVar150._0_4_ + auVar124._0_4_;
  fVar92 = auVar150._4_4_ + auVar124._4_4_;
  fVar93 = auVar150._8_4_ + auVar124._8_4_;
  fVar94 = auVar150._12_4_ + auVar124._12_4_;
  auVar254._0_4_ = auVar120._0_4_ + auVar18._0_4_ * 0.33333334;
  auVar254._4_4_ = auVar120._4_4_ + auVar18._4_4_ * 0.33333334;
  auVar254._8_4_ = auVar120._8_4_ + auVar18._8_4_ * 0.33333334;
  auVar254._12_4_ = auVar120._12_4_ + auVar18._12_4_ * 0.33333334;
  auVar97 = vsubps_avx(auVar120,auVar16);
  auVar201 = vmovsldup_avx(auVar97);
  auVar219 = vmovshdup_avx(auVar97);
  auVar17 = vshufps_avx(auVar97,auVar97,0xaa);
  fVar176 = pre->ray_space[k].vx.field_0.m128[0];
  fVar145 = pre->ray_space[k].vx.field_0.m128[1];
  fVar192 = pre->ray_space[k].vx.field_0.m128[2];
  fVar156 = pre->ray_space[k].vx.field_0.m128[3];
  fVar193 = pre->ray_space[k].vy.field_0.m128[0];
  fVar157 = pre->ray_space[k].vy.field_0.m128[1];
  fVar194 = pre->ray_space[k].vy.field_0.m128[2];
  fVar158 = pre->ray_space[k].vy.field_0.m128[3];
  fVar195 = pre->ray_space[k].vz.field_0.m128[0];
  fVar210 = pre->ray_space[k].vz.field_0.m128[1];
  fVar211 = pre->ray_space[k].vz.field_0.m128[2];
  fVar212 = pre->ray_space[k].vz.field_0.m128[3];
  fVar252 = fVar176 * auVar201._0_4_ + auVar17._0_4_ * fVar195 + fVar193 * auVar219._0_4_;
  fVar260 = fVar145 * auVar201._4_4_ + auVar17._4_4_ * fVar210 + fVar157 * auVar219._4_4_;
  local_5b8._4_4_ = fVar260;
  local_5b8._0_4_ = fVar252;
  fStack_5b0 = fVar192 * auVar201._8_4_ + auVar17._8_4_ * fVar211 + fVar194 * auVar219._8_4_;
  fStack_5ac = fVar156 * auVar201._12_4_ + auVar17._12_4_ * fVar212 + fVar158 * auVar219._12_4_;
  auVar64 = vsubps_avx(auVar254,auVar16);
  auVar17 = vshufps_avx(auVar64,auVar64,0xaa);
  auVar219 = vmovshdup_avx(auVar64);
  auVar201 = vmovsldup_avx(auVar64);
  fVar259 = auVar201._0_4_ * fVar176 + auVar219._0_4_ * fVar193 + fVar195 * auVar17._0_4_;
  fVar261 = auVar201._4_4_ * fVar145 + auVar219._4_4_ * fVar157 + fVar210 * auVar17._4_4_;
  p00.field_0.v[1] = fVar261;
  p00.field_0.v[0] = fVar259;
  p00.field_0.v[2] = auVar201._8_4_ * fVar192 + auVar219._8_4_ * fVar194 + fVar211 * auVar17._8_4_;
  p00.field_0.v[3] =
       auVar201._12_4_ * fVar156 + auVar219._12_4_ * fVar158 + fVar212 * auVar17._12_4_;
  auVar183._0_4_ = auVar265._0_4_ * 0.33333334;
  auVar183._4_4_ = auVar265._4_4_ * 0.33333334;
  auVar183._8_4_ = auVar265._8_4_ * 0.33333334;
  auVar183._12_4_ = auVar265._12_4_ * 0.33333334;
  auVar96 = vsubps_avx(auVar66,auVar183);
  auVar95 = vsubps_avx(auVar96,auVar16);
  auVar17 = vshufps_avx(auVar95,auVar95,0xaa);
  auVar219 = vmovshdup_avx(auVar95);
  auVar201 = vmovsldup_avx(auVar95);
  auVar305._0_4_ = auVar201._0_4_ * fVar176 + auVar219._0_4_ * fVar193 + fVar195 * auVar17._0_4_;
  auVar305._4_4_ = auVar201._4_4_ * fVar145 + auVar219._4_4_ * fVar157 + fVar210 * auVar17._4_4_;
  auVar305._8_4_ = auVar201._8_4_ * fVar192 + auVar219._8_4_ * fVar194 + fVar211 * auVar17._8_4_;
  auVar305._12_4_ = auVar201._12_4_ * fVar156 + auVar219._12_4_ * fVar158 + fVar212 * auVar17._12_4_
  ;
  auVar121 = vsubps_avx(auVar66,auVar16);
  auVar17 = vshufps_avx(auVar121,auVar121,0xaa);
  auVar219 = vmovshdup_avx(auVar121);
  auVar201 = vmovsldup_avx(auVar121);
  auVar288._0_4_ = auVar201._0_4_ * fVar176 + auVar219._0_4_ * fVar193 + auVar17._0_4_ * fVar195;
  auVar288._4_4_ = auVar201._4_4_ * fVar145 + auVar219._4_4_ * fVar157 + auVar17._4_4_ * fVar210;
  auVar288._8_4_ = auVar201._8_4_ * fVar192 + auVar219._8_4_ * fVar194 + auVar17._8_4_ * fVar211;
  auVar288._12_4_ = auVar201._12_4_ * fVar156 + auVar219._12_4_ * fVar158 + auVar17._12_4_ * fVar212
  ;
  auVar122 = vsubps_avx(auVar275,auVar16);
  auVar17 = vshufps_avx(auVar122,auVar122,0xaa);
  auVar219 = vmovshdup_avx(auVar122);
  auVar201 = vmovsldup_avx(auVar122);
  auVar276._0_4_ = auVar201._0_4_ * fVar176 + auVar219._0_4_ * fVar193 + auVar17._0_4_ * fVar195;
  auVar276._4_4_ = auVar201._4_4_ * fVar145 + auVar219._4_4_ * fVar157 + auVar17._4_4_ * fVar210;
  auVar276._8_4_ = auVar201._8_4_ * fVar192 + auVar219._8_4_ * fVar194 + auVar17._8_4_ * fVar211;
  auVar276._12_4_ = auVar201._12_4_ * fVar156 + auVar219._12_4_ * fVar158 + auVar17._12_4_ * fVar212
  ;
  auVar67._0_4_ = (fVar262 + auVar202._0_4_) * 0.33333334 + auVar275._0_4_;
  auVar67._4_4_ = (fVar271 + auVar202._4_4_) * 0.33333334 + auVar275._4_4_;
  auVar67._8_4_ = (fVar272 + auVar202._8_4_) * 0.33333334 + auVar275._8_4_;
  auVar67._12_4_ = (fVar273 + auVar202._12_4_) * 0.33333334 + auVar275._12_4_;
  auVar146 = vsubps_avx(auVar67,auVar16);
  auVar17 = vshufps_avx(auVar146,auVar146,0xaa);
  auVar219 = vmovshdup_avx(auVar146);
  auVar201 = vmovsldup_avx(auVar146);
  auVar240._0_4_ = auVar201._0_4_ * fVar176 + auVar219._0_4_ * fVar193 + auVar17._0_4_ * fVar195;
  auVar240._4_4_ = auVar201._4_4_ * fVar145 + auVar219._4_4_ * fVar157 + auVar17._4_4_ * fVar210;
  auVar240._8_4_ = auVar201._8_4_ * fVar192 + auVar219._8_4_ * fVar194 + auVar17._8_4_ * fVar211;
  auVar240._12_4_ = auVar201._12_4_ * fVar156 + auVar219._12_4_ * fVar158 + auVar17._12_4_ * fVar212
  ;
  auVar220._0_4_ = (fVar274 + auVar98._0_4_) * 0.33333334;
  auVar220._4_4_ = (fVar279 + auVar98._4_4_) * 0.33333334;
  auVar220._8_4_ = (fVar280 + auVar98._8_4_) * 0.33333334;
  auVar220._12_4_ = (fVar281 + auVar98._12_4_) * 0.33333334;
  auVar102._4_4_ = fVar92;
  auVar102._0_4_ = fVar63;
  auVar102._8_4_ = fVar93;
  auVar102._12_4_ = fVar94;
  auVar147 = vsubps_avx(auVar102,auVar220);
  auVar159 = vsubps_avx(auVar147,auVar16);
  auVar17 = vshufps_avx(auVar159,auVar159,0xaa);
  auVar219 = vmovshdup_avx(auVar159);
  auVar201 = vmovsldup_avx(auVar159);
  auVar99._0_4_ = auVar201._0_4_ * fVar176 + auVar219._0_4_ * fVar193 + fVar195 * auVar17._0_4_;
  auVar99._4_4_ = auVar201._4_4_ * fVar145 + auVar219._4_4_ * fVar157 + fVar210 * auVar17._4_4_;
  auVar99._8_4_ = auVar201._8_4_ * fVar192 + auVar219._8_4_ * fVar194 + fVar211 * auVar17._8_4_;
  auVar99._12_4_ = auVar201._12_4_ * fVar156 + auVar219._12_4_ * fVar158 + fVar212 * auVar17._12_4_;
  auVar160 = vsubps_avx(auVar102,auVar16);
  auVar16 = vshufps_avx(auVar160,auVar160,0xaa);
  auVar219 = vmovshdup_avx(auVar160);
  auVar201 = vmovsldup_avx(auVar160);
  auVar68._0_4_ = fVar176 * auVar201._0_4_ + fVar193 * auVar219._0_4_ + fVar195 * auVar16._0_4_;
  auVar68._4_4_ = fVar145 * auVar201._4_4_ + fVar157 * auVar219._4_4_ + fVar210 * auVar16._4_4_;
  auVar68._8_4_ = fVar192 * auVar201._8_4_ + fVar194 * auVar219._8_4_ + fVar211 * auVar16._8_4_;
  auVar68._12_4_ = fVar156 * auVar201._12_4_ + fVar158 * auVar219._12_4_ + fVar212 * auVar16._12_4_;
  auVar17 = vmovlhps_avx(_local_5b8,auVar276);
  auVar265 = vmovlhps_avx((undefined1  [16])p00.field_0,auVar240);
  auVar18 = vmovlhps_avx(auVar305,auVar99);
  auVar65 = vmovlhps_avx(auVar288,auVar68);
  auVar219 = vminps_avx(auVar17,auVar265);
  auVar201 = vminps_avx(auVar18,auVar65);
  auVar16 = vminps_avx(auVar219,auVar201);
  auVar219 = vmaxps_avx(auVar17,auVar265);
  auVar201 = vmaxps_avx(auVar18,auVar65);
  auVar219 = vmaxps_avx(auVar219,auVar201);
  auVar201 = vshufpd_avx(auVar16,auVar16,3);
  auVar16 = vminps_avx(auVar16,auVar201);
  auVar201 = vshufpd_avx(auVar219,auVar219,3);
  auVar201 = vmaxps_avx(auVar219,auVar201);
  auVar203._8_4_ = 0x7fffffff;
  auVar203._0_8_ = 0x7fffffff7fffffff;
  auVar203._12_4_ = 0x7fffffff;
  auVar219 = vandps_avx(auVar16,auVar203);
  auVar201 = vandps_avx(auVar201,auVar203);
  auVar219 = vmaxps_avx(auVar219,auVar201);
  auVar201 = vmovshdup_avx(auVar219);
  auVar219 = vmaxss_avx(auVar201,auVar219);
  fVar145 = auVar219._0_4_ * 9.536743e-07;
  auVar219 = vshufps_avx(ZEXT416((uint)fVar145),ZEXT416((uint)fVar145),0);
  local_78._16_16_ = auVar219;
  local_78._0_16_ = auVar219;
  auVar69._0_8_ = auVar219._0_8_ ^ 0x8000000080000000;
  auVar69._8_4_ = auVar219._8_4_ ^ 0x80000000;
  auVar69._12_4_ = auVar219._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar69;
  local_98._0_16_ = auVar69;
  auVar219 = vpshufd_avx(ZEXT416(uVar57),0);
  auVar201 = vpshufd_avx(ZEXT416(uVar9),0);
  uVar61 = 0;
  fVar176 = *(float *)(ray + k * 4 + 0x30);
  auVar16 = vsubps_avx(auVar265,auVar17);
  auVar177 = vsubps_avx(auVar18,auVar265);
  auVar178 = vsubps_avx(auVar65,auVar18);
  auVar196 = vsubps_avx(auVar275,auVar120);
  auVar197 = vsubps_avx(auVar67,auVar254);
  auVar213 = vsubps_avx(auVar147,auVar96);
  auVar128._4_4_ = fVar92;
  auVar128._0_4_ = fVar63;
  auVar128._8_4_ = fVar93;
  auVar128._12_4_ = fVar94;
  auVar214 = vsubps_avx(auVar128,auVar66);
  auVar300 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar307 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_007a00fb:
  do {
    auVar150 = auVar307._0_16_;
    auVar149 = auVar300._0_16_;
    auVar73 = vshufps_avx(auVar149,auVar149,0x50);
    auVar295._8_4_ = 0x3f800000;
    auVar295._0_8_ = 0x3f8000003f800000;
    auVar295._12_4_ = 0x3f800000;
    auVar299._16_4_ = 0x3f800000;
    auVar299._0_16_ = auVar295;
    auVar299._20_4_ = 0x3f800000;
    auVar299._24_4_ = 0x3f800000;
    auVar299._28_4_ = 0x3f800000;
    auVar234 = vsubps_avx(auVar295,auVar73);
    fVar192 = auVar73._0_4_;
    fVar156 = auVar73._4_4_;
    fVar193 = auVar73._8_4_;
    fVar157 = auVar73._12_4_;
    fVar194 = auVar234._0_4_;
    fVar158 = auVar234._4_4_;
    fVar195 = auVar234._8_4_;
    fVar210 = auVar234._12_4_;
    auVar151._0_4_ = auVar276._0_4_ * fVar192 + fVar194 * fVar252;
    auVar151._4_4_ = auVar276._4_4_ * fVar156 + fVar158 * fVar260;
    auVar151._8_4_ = auVar276._0_4_ * fVar193 + fVar195 * fVar252;
    auVar151._12_4_ = auVar276._4_4_ * fVar157 + fVar210 * fVar260;
    auVar125._0_4_ = auVar240._0_4_ * fVar192 + fVar194 * fVar259;
    auVar125._4_4_ = auVar240._4_4_ * fVar156 + fVar158 * fVar261;
    auVar125._8_4_ = auVar240._0_4_ * fVar193 + fVar195 * fVar259;
    auVar125._12_4_ = auVar240._4_4_ * fVar157 + fVar210 * fVar261;
    auVar221._0_4_ = auVar99._0_4_ * fVar192 + auVar305._0_4_ * fVar194;
    auVar221._4_4_ = auVar99._4_4_ * fVar156 + auVar305._4_4_ * fVar158;
    auVar221._8_4_ = auVar99._0_4_ * fVar193 + auVar305._0_4_ * fVar195;
    auVar221._12_4_ = auVar99._4_4_ * fVar157 + auVar305._4_4_ * fVar210;
    auVar163._0_4_ = auVar68._0_4_ * fVar192 + auVar288._0_4_ * fVar194;
    auVar163._4_4_ = auVar68._4_4_ * fVar156 + auVar288._4_4_ * fVar158;
    auVar163._8_4_ = auVar68._0_4_ * fVar193 + auVar288._0_4_ * fVar195;
    auVar163._12_4_ = auVar68._4_4_ * fVar157 + auVar288._4_4_ * fVar210;
    auVar73 = vmovshdup_avx(auVar150);
    auVar234 = vshufps_avx(auVar150,auVar150,0);
    auVar244._16_16_ = auVar234;
    auVar244._0_16_ = auVar234;
    auVar142 = vshufps_avx(auVar150,auVar150,0x55);
    auVar87._16_16_ = auVar142;
    auVar87._0_16_ = auVar142;
    auVar86 = vsubps_avx(auVar87,auVar244);
    auVar142 = vshufps_avx(auVar151,auVar151,0);
    auVar113 = vshufps_avx(auVar151,auVar151,0x55);
    auVar102 = vshufps_avx(auVar125,auVar125,0);
    auVar128 = vshufps_avx(auVar125,auVar125,0x55);
    auVar69 = vshufps_avx(auVar221,auVar221,0);
    auVar98 = vshufps_avx(auVar221,auVar221,0x55);
    auVar123 = vshufps_avx(auVar163,auVar163,0);
    auVar124 = vshufps_avx(auVar163,auVar163,0x55);
    auVar73 = ZEXT416((uint)((auVar73._0_4_ - auVar307._0_4_) * 0.04761905));
    auVar73 = vshufps_avx(auVar73,auVar73,0);
    auVar258._0_4_ = auVar234._0_4_ + auVar86._0_4_ * 0.0;
    auVar258._4_4_ = auVar234._4_4_ + auVar86._4_4_ * 0.14285715;
    auVar258._8_4_ = auVar234._8_4_ + auVar86._8_4_ * 0.2857143;
    auVar258._12_4_ = auVar234._12_4_ + auVar86._12_4_ * 0.42857146;
    auVar258._16_4_ = auVar234._0_4_ + auVar86._16_4_ * 0.5714286;
    auVar258._20_4_ = auVar234._4_4_ + auVar86._20_4_ * 0.71428573;
    auVar258._24_4_ = auVar234._8_4_ + auVar86._24_4_ * 0.8571429;
    auVar258._28_4_ = auVar234._12_4_ + auVar86._28_4_;
    auVar19 = vsubps_avx(auVar299,auVar258);
    fVar192 = auVar102._0_4_;
    fVar193 = auVar102._4_4_;
    fVar194 = auVar102._8_4_;
    fVar195 = auVar102._12_4_;
    fVar233 = auVar19._0_4_;
    fVar246 = auVar19._4_4_;
    fVar247 = auVar19._8_4_;
    fVar248 = auVar19._12_4_;
    fVar249 = auVar19._16_4_;
    fVar250 = auVar19._20_4_;
    fVar251 = auVar19._24_4_;
    fVar291 = auVar128._0_4_;
    fVar294 = auVar128._4_4_;
    fVar302 = auVar128._8_4_;
    fVar232 = auVar128._12_4_;
    fVar293 = auVar113._12_4_ + 1.0;
    fVar280 = auVar69._0_4_;
    fVar281 = auVar69._4_4_;
    fVar287 = auVar69._8_4_;
    fVar290 = auVar69._12_4_;
    fVar211 = fVar280 * auVar258._0_4_ + fVar233 * fVar192;
    fVar212 = fVar281 * auVar258._4_4_ + fVar246 * fVar193;
    fVar262 = fVar287 * auVar258._8_4_ + fVar247 * fVar194;
    fVar271 = fVar290 * auVar258._12_4_ + fVar248 * fVar195;
    fVar272 = fVar280 * auVar258._16_4_ + fVar249 * fVar192;
    fVar273 = fVar281 * auVar258._20_4_ + fVar250 * fVar193;
    fVar274 = fVar287 * auVar258._24_4_ + fVar251 * fVar194;
    fVar156 = auVar98._0_4_;
    fVar157 = auVar98._4_4_;
    fVar158 = auVar98._8_4_;
    fVar210 = auVar98._12_4_;
    fVar292 = fVar291 * fVar233 + auVar258._0_4_ * fVar156;
    fVar301 = fVar294 * fVar246 + auVar258._4_4_ * fVar157;
    fVar303 = fVar302 * fVar247 + auVar258._8_4_ * fVar158;
    fVar282 = fVar232 * fVar248 + auVar258._12_4_ * fVar210;
    fVar283 = fVar291 * fVar249 + auVar258._16_4_ * fVar156;
    fVar284 = fVar294 * fVar250 + auVar258._20_4_ * fVar157;
    fVar285 = fVar302 * fVar251 + auVar258._24_4_ * fVar158;
    fVar286 = fVar232 + fVar195;
    auVar234 = vshufps_avx(auVar151,auVar151,0xaa);
    auVar102 = vshufps_avx(auVar151,auVar151,0xff);
    fVar279 = fVar290 + 0.0;
    auVar128 = vshufps_avx(auVar125,auVar125,0xaa);
    auVar69 = vshufps_avx(auVar125,auVar125,0xff);
    auVar174._0_4_ =
         fVar233 * (auVar258._0_4_ * fVar192 + fVar233 * auVar142._0_4_) + auVar258._0_4_ * fVar211;
    auVar174._4_4_ =
         fVar246 * (auVar258._4_4_ * fVar193 + fVar246 * auVar142._4_4_) + auVar258._4_4_ * fVar212;
    auVar174._8_4_ =
         fVar247 * (auVar258._8_4_ * fVar194 + fVar247 * auVar142._8_4_) + auVar258._8_4_ * fVar262;
    auVar174._12_4_ =
         fVar248 * (auVar258._12_4_ * fVar195 + fVar248 * auVar142._12_4_) +
         auVar258._12_4_ * fVar271;
    auVar174._16_4_ =
         fVar249 * (auVar258._16_4_ * fVar192 + fVar249 * auVar142._0_4_) +
         auVar258._16_4_ * fVar272;
    auVar174._20_4_ =
         fVar250 * (auVar258._20_4_ * fVar193 + fVar250 * auVar142._4_4_) +
         auVar258._20_4_ * fVar273;
    auVar174._24_4_ =
         fVar251 * (auVar258._24_4_ * fVar194 + fVar251 * auVar142._8_4_) +
         auVar258._24_4_ * fVar274;
    auVar174._28_4_ = auVar142._12_4_ + 1.0 + fVar210;
    auVar190._0_4_ =
         fVar233 * (fVar291 * auVar258._0_4_ + auVar113._0_4_ * fVar233) + auVar258._0_4_ * fVar292;
    auVar190._4_4_ =
         fVar246 * (fVar294 * auVar258._4_4_ + auVar113._4_4_ * fVar246) + auVar258._4_4_ * fVar301;
    auVar190._8_4_ =
         fVar247 * (fVar302 * auVar258._8_4_ + auVar113._8_4_ * fVar247) + auVar258._8_4_ * fVar303;
    auVar190._12_4_ =
         fVar248 * (fVar232 * auVar258._12_4_ + auVar113._12_4_ * fVar248) +
         auVar258._12_4_ * fVar282;
    auVar190._16_4_ =
         fVar249 * (fVar291 * auVar258._16_4_ + auVar113._0_4_ * fVar249) +
         auVar258._16_4_ * fVar283;
    auVar190._20_4_ =
         fVar250 * (fVar294 * auVar258._20_4_ + auVar113._4_4_ * fVar250) +
         auVar258._20_4_ * fVar284;
    auVar190._24_4_ =
         fVar251 * (fVar302 * auVar258._24_4_ + auVar113._8_4_ * fVar251) +
         auVar258._24_4_ * fVar285;
    auVar190._28_4_ = auVar124._12_4_ + fVar210;
    auVar88._0_4_ =
         fVar233 * fVar211 + auVar258._0_4_ * (fVar280 * fVar233 + auVar123._0_4_ * auVar258._0_4_);
    auVar88._4_4_ =
         fVar246 * fVar212 + auVar258._4_4_ * (fVar281 * fVar246 + auVar123._4_4_ * auVar258._4_4_);
    auVar88._8_4_ =
         fVar247 * fVar262 + auVar258._8_4_ * (fVar287 * fVar247 + auVar123._8_4_ * auVar258._8_4_);
    auVar88._12_4_ =
         fVar248 * fVar271 +
         auVar258._12_4_ * (fVar290 * fVar248 + auVar123._12_4_ * auVar258._12_4_);
    auVar88._16_4_ =
         fVar249 * fVar272 +
         auVar258._16_4_ * (fVar280 * fVar249 + auVar123._0_4_ * auVar258._16_4_);
    auVar88._20_4_ =
         fVar250 * fVar273 +
         auVar258._20_4_ * (fVar281 * fVar250 + auVar123._4_4_ * auVar258._20_4_);
    auVar88._24_4_ =
         fVar251 * fVar274 +
         auVar258._24_4_ * (fVar287 * fVar251 + auVar123._8_4_ * auVar258._24_4_);
    auVar88._28_4_ = fVar195 + 1.0 + fVar279;
    auVar270._0_4_ =
         fVar233 * fVar292 + auVar258._0_4_ * (auVar124._0_4_ * auVar258._0_4_ + fVar233 * fVar156);
    auVar270._4_4_ =
         fVar246 * fVar301 + auVar258._4_4_ * (auVar124._4_4_ * auVar258._4_4_ + fVar246 * fVar157);
    auVar270._8_4_ =
         fVar247 * fVar303 + auVar258._8_4_ * (auVar124._8_4_ * auVar258._8_4_ + fVar247 * fVar158);
    auVar270._12_4_ =
         fVar248 * fVar282 +
         auVar258._12_4_ * (auVar124._12_4_ * auVar258._12_4_ + fVar248 * fVar210);
    auVar270._16_4_ =
         fVar249 * fVar283 +
         auVar258._16_4_ * (auVar124._0_4_ * auVar258._16_4_ + fVar249 * fVar156);
    auVar270._20_4_ =
         fVar250 * fVar284 +
         auVar258._20_4_ * (auVar124._4_4_ * auVar258._20_4_ + fVar250 * fVar157);
    auVar270._24_4_ =
         fVar251 * fVar285 +
         auVar258._24_4_ * (auVar124._8_4_ * auVar258._24_4_ + fVar251 * fVar158);
    auVar270._28_4_ = fVar279 + fVar210 + 0.0;
    local_d8._0_4_ = fVar233 * auVar174._0_4_ + auVar258._0_4_ * auVar88._0_4_;
    local_d8._4_4_ = fVar246 * auVar174._4_4_ + auVar258._4_4_ * auVar88._4_4_;
    local_d8._8_4_ = fVar247 * auVar174._8_4_ + auVar258._8_4_ * auVar88._8_4_;
    local_d8._12_4_ = fVar248 * auVar174._12_4_ + auVar258._12_4_ * auVar88._12_4_;
    local_d8._16_4_ = fVar249 * auVar174._16_4_ + auVar258._16_4_ * auVar88._16_4_;
    local_d8._20_4_ = fVar250 * auVar174._20_4_ + auVar258._20_4_ * auVar88._20_4_;
    local_d8._24_4_ = fVar251 * auVar174._24_4_ + auVar258._24_4_ * auVar88._24_4_;
    local_d8._28_4_ = fVar286 + fVar210 + 0.0;
    auVar155._0_4_ = fVar233 * auVar190._0_4_ + auVar258._0_4_ * auVar270._0_4_;
    auVar155._4_4_ = fVar246 * auVar190._4_4_ + auVar258._4_4_ * auVar270._4_4_;
    auVar155._8_4_ = fVar247 * auVar190._8_4_ + auVar258._8_4_ * auVar270._8_4_;
    auVar155._12_4_ = fVar248 * auVar190._12_4_ + auVar258._12_4_ * auVar270._12_4_;
    auVar155._16_4_ = fVar249 * auVar190._16_4_ + auVar258._16_4_ * auVar270._16_4_;
    auVar155._20_4_ = fVar250 * auVar190._20_4_ + auVar258._20_4_ * auVar270._20_4_;
    auVar155._24_4_ = fVar251 * auVar190._24_4_ + auVar258._24_4_ * auVar270._24_4_;
    auVar155._28_4_ = fVar286 + fVar279;
    auVar20 = vsubps_avx(auVar88,auVar174);
    auVar86 = vsubps_avx(auVar270,auVar190);
    local_4c8 = auVar73._0_4_;
    fStack_4c4 = auVar73._4_4_;
    fStack_4c0 = auVar73._8_4_;
    fStack_4bc = auVar73._12_4_;
    local_118 = local_4c8 * auVar20._0_4_ * 3.0;
    fStack_114 = fStack_4c4 * auVar20._4_4_ * 3.0;
    auVar21._4_4_ = fStack_114;
    auVar21._0_4_ = local_118;
    fStack_110 = fStack_4c0 * auVar20._8_4_ * 3.0;
    auVar21._8_4_ = fStack_110;
    fStack_10c = fStack_4bc * auVar20._12_4_ * 3.0;
    auVar21._12_4_ = fStack_10c;
    fStack_108 = local_4c8 * auVar20._16_4_ * 3.0;
    auVar21._16_4_ = fStack_108;
    fStack_104 = fStack_4c4 * auVar20._20_4_ * 3.0;
    auVar21._20_4_ = fStack_104;
    fStack_100 = fStack_4c0 * auVar20._24_4_ * 3.0;
    auVar21._24_4_ = fStack_100;
    auVar21._28_4_ = auVar20._28_4_;
    local_138 = local_4c8 * auVar86._0_4_ * 3.0;
    fStack_134 = fStack_4c4 * auVar86._4_4_ * 3.0;
    auVar22._4_4_ = fStack_134;
    auVar22._0_4_ = local_138;
    fStack_130 = fStack_4c0 * auVar86._8_4_ * 3.0;
    auVar22._8_4_ = fStack_130;
    fStack_12c = fStack_4bc * auVar86._12_4_ * 3.0;
    auVar22._12_4_ = fStack_12c;
    fStack_128 = local_4c8 * auVar86._16_4_ * 3.0;
    auVar22._16_4_ = fStack_128;
    fStack_124 = fStack_4c4 * auVar86._20_4_ * 3.0;
    auVar22._20_4_ = fStack_124;
    fStack_120 = fStack_4c0 * auVar86._24_4_ * 3.0;
    auVar22._24_4_ = fStack_120;
    auVar22._28_4_ = fVar286;
    auVar21 = vsubps_avx(local_d8,auVar21);
    auVar86 = vperm2f128_avx(auVar21,auVar21,1);
    auVar86 = vshufps_avx(auVar86,auVar21,0x30);
    auVar86 = vshufps_avx(auVar21,auVar86,0x29);
    auVar22 = vsubps_avx(auVar155,auVar22);
    auVar21 = vperm2f128_avx(auVar22,auVar22,1);
    auVar21 = vshufps_avx(auVar21,auVar22,0x30);
    auVar22 = vshufps_avx(auVar22,auVar21,0x29);
    fVar284 = auVar128._0_4_;
    fVar285 = auVar128._4_4_;
    fVar308 = auVar128._8_4_;
    fVar195 = auVar234._12_4_;
    fVar281 = auVar69._0_4_;
    fVar290 = auVar69._4_4_;
    fVar292 = auVar69._8_4_;
    fVar301 = auVar69._12_4_;
    auVar73 = vshufps_avx(auVar221,auVar221,0xaa);
    fVar192 = auVar73._0_4_;
    fVar193 = auVar73._4_4_;
    fVar194 = auVar73._8_4_;
    fVar210 = auVar73._12_4_;
    fVar262 = auVar258._0_4_ * fVar192 + fVar284 * fVar233;
    fVar271 = auVar258._4_4_ * fVar193 + fVar285 * fVar246;
    fVar272 = auVar258._8_4_ * fVar194 + fVar308 * fVar247;
    fVar273 = auVar258._12_4_ * fVar210 + auVar128._12_4_ * fVar248;
    fVar274 = auVar258._16_4_ * fVar192 + fVar284 * fVar249;
    fVar279 = auVar258._20_4_ * fVar193 + fVar285 * fVar250;
    fVar280 = auVar258._24_4_ * fVar194 + fVar308 * fVar251;
    auVar73 = vshufps_avx(auVar221,auVar221,0xff);
    fVar156 = auVar73._0_4_;
    fVar157 = auVar73._4_4_;
    fVar158 = auVar73._8_4_;
    fVar211 = auVar73._12_4_;
    fVar287 = auVar258._0_4_ * fVar156 + fVar281 * fVar233;
    fVar291 = auVar258._4_4_ * fVar157 + fVar290 * fVar246;
    fVar294 = auVar258._8_4_ * fVar158 + fVar292 * fVar247;
    fVar302 = auVar258._12_4_ * fVar211 + fVar301 * fVar248;
    fVar303 = auVar258._16_4_ * fVar156 + fVar281 * fVar249;
    fVar232 = auVar258._20_4_ * fVar157 + fVar290 * fVar250;
    fVar282 = auVar258._24_4_ * fVar158 + fVar292 * fVar251;
    auVar73 = vshufps_avx(auVar163,auVar163,0xaa);
    fVar283 = auVar73._12_4_ + fVar210;
    auVar142 = vshufps_avx(auVar163,auVar163,0xff);
    fVar212 = auVar142._12_4_;
    auVar89._0_4_ =
         fVar233 * (fVar284 * auVar258._0_4_ + fVar233 * auVar234._0_4_) + auVar258._0_4_ * fVar262;
    auVar89._4_4_ =
         fVar246 * (fVar285 * auVar258._4_4_ + fVar246 * auVar234._4_4_) + auVar258._4_4_ * fVar271;
    auVar89._8_4_ =
         fVar247 * (fVar308 * auVar258._8_4_ + fVar247 * auVar234._8_4_) + auVar258._8_4_ * fVar272;
    auVar89._12_4_ =
         fVar248 * (auVar128._12_4_ * auVar258._12_4_ + fVar248 * fVar195) +
         auVar258._12_4_ * fVar273;
    auVar89._16_4_ =
         fVar249 * (fVar284 * auVar258._16_4_ + fVar249 * auVar234._0_4_) +
         auVar258._16_4_ * fVar274;
    auVar89._20_4_ =
         fVar250 * (fVar285 * auVar258._20_4_ + fVar250 * auVar234._4_4_) +
         auVar258._20_4_ * fVar279;
    auVar89._24_4_ =
         fVar251 * (fVar308 * auVar258._24_4_ + fVar251 * auVar234._8_4_) +
         auVar258._24_4_ * fVar280;
    auVar89._28_4_ = auVar22._28_4_ + fVar195 + fVar212;
    auVar116._0_4_ =
         fVar233 * (fVar281 * auVar258._0_4_ + auVar102._0_4_ * fVar233) + auVar258._0_4_ * fVar287;
    auVar116._4_4_ =
         fVar246 * (fVar290 * auVar258._4_4_ + auVar102._4_4_ * fVar246) + auVar258._4_4_ * fVar291;
    auVar116._8_4_ =
         fVar247 * (fVar292 * auVar258._8_4_ + auVar102._8_4_ * fVar247) + auVar258._8_4_ * fVar294;
    auVar116._12_4_ =
         fVar248 * (fVar301 * auVar258._12_4_ + auVar102._12_4_ * fVar248) +
         auVar258._12_4_ * fVar302;
    auVar116._16_4_ =
         fVar249 * (fVar281 * auVar258._16_4_ + auVar102._0_4_ * fVar249) +
         auVar258._16_4_ * fVar303;
    auVar116._20_4_ =
         fVar250 * (fVar290 * auVar258._20_4_ + auVar102._4_4_ * fVar250) +
         auVar258._20_4_ * fVar232;
    auVar116._24_4_ =
         fVar251 * (fVar292 * auVar258._24_4_ + auVar102._8_4_ * fVar251) +
         auVar258._24_4_ * fVar282;
    auVar116._28_4_ = fVar195 + auVar21._28_4_ + fVar212;
    auVar21 = vperm2f128_avx(local_d8,local_d8,1);
    auVar21 = vshufps_avx(auVar21,local_d8,0x30);
    auVar87 = vshufps_avx(local_d8,auVar21,0x29);
    auVar191._0_4_ =
         auVar258._0_4_ * (auVar73._0_4_ * auVar258._0_4_ + fVar233 * fVar192) + fVar233 * fVar262;
    auVar191._4_4_ =
         auVar258._4_4_ * (auVar73._4_4_ * auVar258._4_4_ + fVar246 * fVar193) + fVar246 * fVar271;
    auVar191._8_4_ =
         auVar258._8_4_ * (auVar73._8_4_ * auVar258._8_4_ + fVar247 * fVar194) + fVar247 * fVar272;
    auVar191._12_4_ =
         auVar258._12_4_ * (auVar73._12_4_ * auVar258._12_4_ + fVar248 * fVar210) +
         fVar248 * fVar273;
    auVar191._16_4_ =
         auVar258._16_4_ * (auVar73._0_4_ * auVar258._16_4_ + fVar249 * fVar192) + fVar249 * fVar274
    ;
    auVar191._20_4_ =
         auVar258._20_4_ * (auVar73._4_4_ * auVar258._20_4_ + fVar250 * fVar193) + fVar250 * fVar279
    ;
    auVar191._24_4_ =
         auVar258._24_4_ * (auVar73._8_4_ * auVar258._24_4_ + fVar251 * fVar194) + fVar251 * fVar280
    ;
    auVar191._28_4_ = fVar283 + fVar293 + auVar190._28_4_;
    auVar231._0_4_ =
         fVar233 * fVar287 + auVar258._0_4_ * (auVar258._0_4_ * auVar142._0_4_ + fVar233 * fVar156);
    auVar231._4_4_ =
         fVar246 * fVar291 + auVar258._4_4_ * (auVar258._4_4_ * auVar142._4_4_ + fVar246 * fVar157);
    auVar231._8_4_ =
         fVar247 * fVar294 + auVar258._8_4_ * (auVar258._8_4_ * auVar142._8_4_ + fVar247 * fVar158);
    auVar231._12_4_ =
         fVar248 * fVar302 + auVar258._12_4_ * (auVar258._12_4_ * fVar212 + fVar248 * fVar211);
    auVar231._16_4_ =
         fVar249 * fVar303 +
         auVar258._16_4_ * (auVar258._16_4_ * auVar142._0_4_ + fVar249 * fVar156);
    auVar231._20_4_ =
         fVar250 * fVar232 +
         auVar258._20_4_ * (auVar258._20_4_ * auVar142._4_4_ + fVar250 * fVar157);
    auVar231._24_4_ =
         fVar251 * fVar282 +
         auVar258._24_4_ * (auVar258._24_4_ * auVar142._8_4_ + fVar251 * fVar158);
    auVar231._28_4_ = fVar293 + fVar301 + fVar212 + fVar211;
    auVar224._0_4_ = fVar233 * auVar89._0_4_ + auVar258._0_4_ * auVar191._0_4_;
    auVar224._4_4_ = fVar246 * auVar89._4_4_ + auVar258._4_4_ * auVar191._4_4_;
    auVar224._8_4_ = fVar247 * auVar89._8_4_ + auVar258._8_4_ * auVar191._8_4_;
    auVar224._12_4_ = fVar248 * auVar89._12_4_ + auVar258._12_4_ * auVar191._12_4_;
    auVar224._16_4_ = fVar249 * auVar89._16_4_ + auVar258._16_4_ * auVar191._16_4_;
    auVar224._20_4_ = fVar250 * auVar89._20_4_ + auVar258._20_4_ * auVar191._20_4_;
    auVar224._24_4_ = fVar251 * auVar89._24_4_ + auVar258._24_4_ * auVar191._24_4_;
    auVar224._28_4_ = fVar283 + fVar212 + fVar211;
    auVar245._0_4_ = fVar233 * auVar116._0_4_ + auVar258._0_4_ * auVar231._0_4_;
    auVar245._4_4_ = fVar246 * auVar116._4_4_ + auVar258._4_4_ * auVar231._4_4_;
    auVar245._8_4_ = fVar247 * auVar116._8_4_ + auVar258._8_4_ * auVar231._8_4_;
    auVar245._12_4_ = fVar248 * auVar116._12_4_ + auVar258._12_4_ * auVar231._12_4_;
    auVar245._16_4_ = fVar249 * auVar116._16_4_ + auVar258._16_4_ * auVar231._16_4_;
    auVar245._20_4_ = fVar250 * auVar116._20_4_ + auVar258._20_4_ * auVar231._20_4_;
    auVar245._24_4_ = fVar251 * auVar116._24_4_ + auVar258._24_4_ * auVar231._24_4_;
    auVar245._28_4_ = auVar19._28_4_ + auVar258._28_4_;
    auVar23 = vsubps_avx(auVar191,auVar89);
    auVar21 = vsubps_avx(auVar231,auVar116);
    local_158 = local_4c8 * auVar23._0_4_ * 3.0;
    fStack_154 = fStack_4c4 * auVar23._4_4_ * 3.0;
    auVar19._4_4_ = fStack_154;
    auVar19._0_4_ = local_158;
    fStack_150 = fStack_4c0 * auVar23._8_4_ * 3.0;
    auVar19._8_4_ = fStack_150;
    fStack_14c = fStack_4bc * auVar23._12_4_ * 3.0;
    auVar19._12_4_ = fStack_14c;
    fStack_148 = local_4c8 * auVar23._16_4_ * 3.0;
    auVar19._16_4_ = fStack_148;
    fStack_144 = fStack_4c4 * auVar23._20_4_ * 3.0;
    auVar19._20_4_ = fStack_144;
    fStack_140 = fStack_4c0 * auVar23._24_4_ * 3.0;
    auVar19._24_4_ = fStack_140;
    auVar19._28_4_ = auVar23._28_4_;
    local_178 = local_4c8 * auVar21._0_4_ * 3.0;
    fStack_174 = fStack_4c4 * auVar21._4_4_ * 3.0;
    auVar24._4_4_ = fStack_174;
    auVar24._0_4_ = local_178;
    fStack_170 = fStack_4c0 * auVar21._8_4_ * 3.0;
    auVar24._8_4_ = fStack_170;
    fStack_16c = fStack_4bc * auVar21._12_4_ * 3.0;
    auVar24._12_4_ = fStack_16c;
    fStack_168 = local_4c8 * auVar21._16_4_ * 3.0;
    auVar24._16_4_ = fStack_168;
    fStack_164 = fStack_4c4 * auVar21._20_4_ * 3.0;
    auVar24._20_4_ = fStack_164;
    fStack_160 = fStack_4c0 * auVar21._24_4_ * 3.0;
    auVar24._24_4_ = fStack_160;
    auVar24._28_4_ = auVar191._28_4_;
    auVar21 = vperm2f128_avx(auVar224,auVar224,1);
    auVar21 = vshufps_avx(auVar21,auVar224,0x30);
    auVar88 = vshufps_avx(auVar224,auVar21,0x29);
    auVar19 = vsubps_avx(auVar224,auVar19);
    auVar21 = vperm2f128_avx(auVar19,auVar19,1);
    auVar21 = vshufps_avx(auVar21,auVar19,0x30);
    auVar21 = vshufps_avx(auVar19,auVar21,0x29);
    auVar24 = vsubps_avx(auVar245,auVar24);
    auVar19 = vperm2f128_avx(auVar24,auVar24,1);
    auVar19 = vshufps_avx(auVar19,auVar24,0x30);
    local_b8 = vshufps_avx(auVar24,auVar19,0x29);
    auVar25 = vsubps_avx(auVar224,local_d8);
    auVar89 = vsubps_avx(auVar88,auVar87);
    fVar192 = auVar89._0_4_ + auVar25._0_4_;
    fVar156 = auVar89._4_4_ + auVar25._4_4_;
    fVar193 = auVar89._8_4_ + auVar25._8_4_;
    fVar157 = auVar89._12_4_ + auVar25._12_4_;
    fVar194 = auVar89._16_4_ + auVar25._16_4_;
    fVar158 = auVar89._20_4_ + auVar25._20_4_;
    fVar195 = auVar89._24_4_ + auVar25._24_4_;
    auVar19 = vperm2f128_avx(auVar155,auVar155,1);
    auVar19 = vshufps_avx(auVar19,auVar155,0x30);
    local_f8 = vshufps_avx(auVar155,auVar19,0x29);
    auVar19 = vperm2f128_avx(auVar245,auVar245,1);
    auVar19 = vshufps_avx(auVar19,auVar245,0x30);
    auVar24 = vshufps_avx(auVar245,auVar19,0x29);
    auVar19 = vsubps_avx(auVar245,auVar155);
    auVar116 = vsubps_avx(auVar24,local_f8);
    fVar210 = auVar116._0_4_ + auVar19._0_4_;
    fVar211 = auVar116._4_4_ + auVar19._4_4_;
    fVar212 = auVar116._8_4_ + auVar19._8_4_;
    fVar262 = auVar116._12_4_ + auVar19._12_4_;
    fVar271 = auVar116._16_4_ + auVar19._16_4_;
    fVar272 = auVar116._20_4_ + auVar19._20_4_;
    fVar273 = auVar116._24_4_ + auVar19._24_4_;
    auVar26._4_4_ = fVar156 * auVar155._4_4_;
    auVar26._0_4_ = fVar192 * auVar155._0_4_;
    auVar26._8_4_ = fVar193 * auVar155._8_4_;
    auVar26._12_4_ = fVar157 * auVar155._12_4_;
    auVar26._16_4_ = fVar194 * auVar155._16_4_;
    auVar26._20_4_ = fVar158 * auVar155._20_4_;
    auVar26._24_4_ = fVar195 * auVar155._24_4_;
    auVar26._28_4_ = auVar19._28_4_;
    auVar27._4_4_ = fVar211 * local_d8._4_4_;
    auVar27._0_4_ = fVar210 * local_d8._0_4_;
    auVar27._8_4_ = fVar212 * local_d8._8_4_;
    auVar27._12_4_ = fVar262 * local_d8._12_4_;
    auVar27._16_4_ = fVar271 * local_d8._16_4_;
    auVar27._20_4_ = fVar272 * local_d8._20_4_;
    auVar27._24_4_ = fVar273 * local_d8._24_4_;
    auVar27._28_4_ = fVar283;
    auVar26 = vsubps_avx(auVar26,auVar27);
    local_118 = local_d8._0_4_ + local_118;
    fStack_114 = local_d8._4_4_ + fStack_114;
    fStack_110 = local_d8._8_4_ + fStack_110;
    fStack_10c = local_d8._12_4_ + fStack_10c;
    fStack_108 = local_d8._16_4_ + fStack_108;
    fStack_104 = local_d8._20_4_ + fStack_104;
    fStack_100 = local_d8._24_4_ + fStack_100;
    fStack_fc = local_d8._28_4_ + auVar20._28_4_;
    local_138 = local_138 + auVar155._0_4_;
    fStack_134 = fStack_134 + auVar155._4_4_;
    fStack_130 = fStack_130 + auVar155._8_4_;
    fStack_12c = fStack_12c + auVar155._12_4_;
    fStack_128 = fStack_128 + auVar155._16_4_;
    fStack_124 = fStack_124 + auVar155._20_4_;
    fStack_120 = fStack_120 + auVar155._24_4_;
    fStack_11c = fVar286 + auVar155._28_4_;
    auVar20._4_4_ = fVar156 * fStack_134;
    auVar20._0_4_ = fVar192 * local_138;
    auVar20._8_4_ = fVar193 * fStack_130;
    auVar20._12_4_ = fVar157 * fStack_12c;
    auVar20._16_4_ = fVar194 * fStack_128;
    auVar20._20_4_ = fVar158 * fStack_124;
    auVar20._24_4_ = fVar195 * fStack_120;
    auVar20._28_4_ = fVar286;
    auVar28._4_4_ = fVar211 * fStack_114;
    auVar28._0_4_ = fVar210 * local_118;
    auVar28._8_4_ = fVar212 * fStack_110;
    auVar28._12_4_ = fVar262 * fStack_10c;
    auVar28._16_4_ = fVar271 * fStack_108;
    auVar28._20_4_ = fVar272 * fStack_104;
    auVar28._24_4_ = fVar273 * fStack_100;
    auVar28._28_4_ = fVar286 + auVar155._28_4_;
    auVar20 = vsubps_avx(auVar20,auVar28);
    local_578 = auVar22._0_4_;
    fStack_574 = auVar22._4_4_;
    fStack_570 = auVar22._8_4_;
    fStack_56c = auVar22._12_4_;
    fStack_568 = auVar22._16_4_;
    fStack_564 = auVar22._20_4_;
    fStack_560 = auVar22._24_4_;
    auVar29._4_4_ = fVar156 * fStack_574;
    auVar29._0_4_ = fVar192 * local_578;
    auVar29._8_4_ = fVar193 * fStack_570;
    auVar29._12_4_ = fVar157 * fStack_56c;
    auVar29._16_4_ = fVar194 * fStack_568;
    auVar29._20_4_ = fVar158 * fStack_564;
    auVar29._24_4_ = fVar195 * fStack_560;
    auVar29._28_4_ = fVar286;
    local_5b8._0_4_ = auVar86._0_4_;
    local_5b8._4_4_ = auVar86._4_4_;
    fStack_5b0 = auVar86._8_4_;
    fStack_5ac = auVar86._12_4_;
    fStack_5a8 = auVar86._16_4_;
    fStack_5a4 = auVar86._20_4_;
    fStack_5a0 = auVar86._24_4_;
    auVar30._4_4_ = fVar211 * (float)local_5b8._4_4_;
    auVar30._0_4_ = fVar210 * (float)local_5b8._0_4_;
    auVar30._8_4_ = fVar212 * fStack_5b0;
    auVar30._12_4_ = fVar262 * fStack_5ac;
    auVar30._16_4_ = fVar271 * fStack_5a8;
    auVar30._20_4_ = fVar272 * fStack_5a4;
    auVar30._24_4_ = fVar273 * fStack_5a0;
    auVar30._28_4_ = local_d8._28_4_;
    auVar27 = vsubps_avx(auVar29,auVar30);
    auVar31._4_4_ = local_f8._4_4_ * fVar156;
    auVar31._0_4_ = local_f8._0_4_ * fVar192;
    auVar31._8_4_ = local_f8._8_4_ * fVar193;
    auVar31._12_4_ = local_f8._12_4_ * fVar157;
    auVar31._16_4_ = local_f8._16_4_ * fVar194;
    auVar31._20_4_ = local_f8._20_4_ * fVar158;
    auVar31._24_4_ = local_f8._24_4_ * fVar195;
    auVar31._28_4_ = fVar286;
    auVar32._4_4_ = auVar87._4_4_ * fVar211;
    auVar32._0_4_ = auVar87._0_4_ * fVar210;
    auVar32._8_4_ = auVar87._8_4_ * fVar212;
    auVar32._12_4_ = auVar87._12_4_ * fVar262;
    auVar32._16_4_ = auVar87._16_4_ * fVar271;
    auVar32._20_4_ = auVar87._20_4_ * fVar272;
    auVar32._24_4_ = auVar87._24_4_ * fVar273;
    auVar32._28_4_ = local_f8._28_4_;
    local_4c8 = auVar21._0_4_;
    fStack_4c4 = auVar21._4_4_;
    fStack_4c0 = auVar21._8_4_;
    fStack_4bc = auVar21._12_4_;
    fStack_4b8 = auVar21._16_4_;
    fStack_4b4 = auVar21._20_4_;
    fStack_4b0 = auVar21._24_4_;
    auVar28 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = auVar245._4_4_ * fVar156;
    auVar33._0_4_ = auVar245._0_4_ * fVar192;
    auVar33._8_4_ = auVar245._8_4_ * fVar193;
    auVar33._12_4_ = auVar245._12_4_ * fVar157;
    auVar33._16_4_ = auVar245._16_4_ * fVar194;
    auVar33._20_4_ = auVar245._20_4_ * fVar158;
    auVar33._24_4_ = auVar245._24_4_ * fVar195;
    auVar33._28_4_ = fVar286;
    auVar34._4_4_ = fVar211 * auVar224._4_4_;
    auVar34._0_4_ = fVar210 * auVar224._0_4_;
    auVar34._8_4_ = fVar212 * auVar224._8_4_;
    auVar34._12_4_ = fVar262 * auVar224._12_4_;
    auVar34._16_4_ = fVar271 * auVar224._16_4_;
    auVar34._20_4_ = fVar272 * auVar224._20_4_;
    auVar34._24_4_ = fVar273 * auVar224._24_4_;
    auVar34._28_4_ = fStack_fc;
    auVar29 = vsubps_avx(auVar33,auVar34);
    local_158 = auVar224._0_4_ + local_158;
    fStack_154 = auVar224._4_4_ + fStack_154;
    fStack_150 = auVar224._8_4_ + fStack_150;
    fStack_14c = auVar224._12_4_ + fStack_14c;
    fStack_148 = auVar224._16_4_ + fStack_148;
    fStack_144 = auVar224._20_4_ + fStack_144;
    fStack_140 = auVar224._24_4_ + fStack_140;
    fStack_13c = auVar224._28_4_ + auVar23._28_4_;
    local_178 = auVar245._0_4_ + local_178;
    fStack_174 = auVar245._4_4_ + fStack_174;
    fStack_170 = auVar245._8_4_ + fStack_170;
    fStack_16c = auVar245._12_4_ + fStack_16c;
    fStack_168 = auVar245._16_4_ + fStack_168;
    fStack_164 = auVar245._20_4_ + fStack_164;
    fStack_160 = auVar245._24_4_ + fStack_160;
    fStack_15c = auVar245._28_4_ + auVar191._28_4_;
    auVar23._4_4_ = fVar156 * fStack_174;
    auVar23._0_4_ = fVar192 * local_178;
    auVar23._8_4_ = fVar193 * fStack_170;
    auVar23._12_4_ = fVar157 * fStack_16c;
    auVar23._16_4_ = fVar194 * fStack_168;
    auVar23._20_4_ = fVar158 * fStack_164;
    auVar23._24_4_ = fVar195 * fStack_160;
    auVar23._28_4_ = auVar245._28_4_ + auVar191._28_4_;
    auVar35._4_4_ = fStack_154 * fVar211;
    auVar35._0_4_ = local_158 * fVar210;
    auVar35._8_4_ = fStack_150 * fVar212;
    auVar35._12_4_ = fStack_14c * fVar262;
    auVar35._16_4_ = fStack_148 * fVar271;
    auVar35._20_4_ = fStack_144 * fVar272;
    auVar35._24_4_ = fStack_140 * fVar273;
    auVar35._28_4_ = fStack_13c;
    auVar23 = vsubps_avx(auVar23,auVar35);
    auVar36._4_4_ = fVar156 * local_b8._4_4_;
    auVar36._0_4_ = fVar192 * local_b8._0_4_;
    auVar36._8_4_ = fVar193 * local_b8._8_4_;
    auVar36._12_4_ = fVar157 * local_b8._12_4_;
    auVar36._16_4_ = fVar194 * local_b8._16_4_;
    auVar36._20_4_ = fVar158 * local_b8._20_4_;
    auVar36._24_4_ = fVar195 * local_b8._24_4_;
    auVar36._28_4_ = fStack_13c;
    auVar37._4_4_ = fVar211 * fStack_4c4;
    auVar37._0_4_ = fVar210 * local_4c8;
    auVar37._8_4_ = fVar212 * fStack_4c0;
    auVar37._12_4_ = fVar262 * fStack_4bc;
    auVar37._16_4_ = fVar271 * fStack_4b8;
    auVar37._20_4_ = fVar272 * fStack_4b4;
    auVar37._24_4_ = fVar273 * fStack_4b0;
    auVar37._28_4_ = local_b8._28_4_;
    auVar30 = vsubps_avx(auVar36,auVar37);
    auVar38._4_4_ = fVar156 * auVar24._4_4_;
    auVar38._0_4_ = fVar192 * auVar24._0_4_;
    auVar38._8_4_ = fVar193 * auVar24._8_4_;
    auVar38._12_4_ = fVar157 * auVar24._12_4_;
    auVar38._16_4_ = fVar194 * auVar24._16_4_;
    auVar38._20_4_ = fVar158 * auVar24._20_4_;
    auVar38._24_4_ = fVar195 * auVar24._24_4_;
    auVar38._28_4_ = auVar89._28_4_ + auVar25._28_4_;
    auVar25._4_4_ = auVar88._4_4_ * fVar211;
    auVar25._0_4_ = auVar88._0_4_ * fVar210;
    auVar25._8_4_ = auVar88._8_4_ * fVar212;
    auVar25._12_4_ = auVar88._12_4_ * fVar262;
    auVar25._16_4_ = auVar88._16_4_ * fVar271;
    auVar25._20_4_ = auVar88._20_4_ * fVar272;
    auVar25._24_4_ = auVar88._24_4_ * fVar273;
    auVar25._28_4_ = auVar116._28_4_ + auVar19._28_4_;
    auVar25 = vsubps_avx(auVar38,auVar25);
    auVar21 = vminps_avx(auVar26,auVar20);
    auVar86 = vmaxps_avx(auVar26,auVar20);
    auVar22 = vminps_avx(auVar27,auVar28);
    auVar22 = vminps_avx(auVar21,auVar22);
    auVar21 = vmaxps_avx(auVar27,auVar28);
    auVar86 = vmaxps_avx(auVar86,auVar21);
    auVar19 = vminps_avx(auVar29,auVar23);
    auVar21 = vmaxps_avx(auVar29,auVar23);
    auVar20 = vminps_avx(auVar30,auVar25);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar20 = vminps_avx(auVar22,auVar20);
    auVar22 = vmaxps_avx(auVar30,auVar25);
    auVar21 = vmaxps_avx(auVar21,auVar22);
    auVar21 = vmaxps_avx(auVar86,auVar21);
    auVar86 = vcmpps_avx(auVar20,local_78,2);
    auVar21 = vcmpps_avx(auVar21,local_98,5);
    auVar86 = vandps_avx(auVar21,auVar86);
    auVar21 = local_198 & auVar86;
    if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0x7f,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar21 >> 0xbf,0) != '\0') ||
        (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar21[0x1f] < '\0')
    {
      auVar21 = vsubps_avx(auVar87,local_d8);
      auVar22 = vsubps_avx(auVar88,auVar224);
      fVar156 = auVar21._0_4_ + auVar22._0_4_;
      fVar193 = auVar21._4_4_ + auVar22._4_4_;
      fVar157 = auVar21._8_4_ + auVar22._8_4_;
      fVar194 = auVar21._12_4_ + auVar22._12_4_;
      fVar158 = auVar21._16_4_ + auVar22._16_4_;
      fVar195 = auVar21._20_4_ + auVar22._20_4_;
      fVar210 = auVar21._24_4_ + auVar22._24_4_;
      auVar20 = vsubps_avx(local_f8,auVar155);
      auVar23 = vsubps_avx(auVar24,auVar245);
      fVar211 = auVar20._0_4_ + auVar23._0_4_;
      fVar212 = auVar20._4_4_ + auVar23._4_4_;
      fVar262 = auVar20._8_4_ + auVar23._8_4_;
      fVar271 = auVar20._12_4_ + auVar23._12_4_;
      fVar272 = auVar20._16_4_ + auVar23._16_4_;
      fVar273 = auVar20._20_4_ + auVar23._20_4_;
      fVar274 = auVar20._24_4_ + auVar23._24_4_;
      fVar192 = auVar23._28_4_;
      auVar39._4_4_ = auVar155._4_4_ * fVar193;
      auVar39._0_4_ = auVar155._0_4_ * fVar156;
      auVar39._8_4_ = auVar155._8_4_ * fVar157;
      auVar39._12_4_ = auVar155._12_4_ * fVar194;
      auVar39._16_4_ = auVar155._16_4_ * fVar158;
      auVar39._20_4_ = auVar155._20_4_ * fVar195;
      auVar39._24_4_ = auVar155._24_4_ * fVar210;
      auVar39._28_4_ = auVar155._28_4_;
      auVar40._4_4_ = local_d8._4_4_ * fVar212;
      auVar40._0_4_ = local_d8._0_4_ * fVar211;
      auVar40._8_4_ = local_d8._8_4_ * fVar262;
      auVar40._12_4_ = local_d8._12_4_ * fVar271;
      auVar40._16_4_ = local_d8._16_4_ * fVar272;
      auVar40._20_4_ = local_d8._20_4_ * fVar273;
      auVar40._24_4_ = local_d8._24_4_ * fVar274;
      auVar40._28_4_ = local_d8._28_4_;
      auVar23 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = fVar193 * fStack_134;
      auVar41._0_4_ = fVar156 * local_138;
      auVar41._8_4_ = fVar157 * fStack_130;
      auVar41._12_4_ = fVar194 * fStack_12c;
      auVar41._16_4_ = fVar158 * fStack_128;
      auVar41._20_4_ = fVar195 * fStack_124;
      auVar41._24_4_ = fVar210 * fStack_120;
      auVar41._28_4_ = auVar155._28_4_;
      auVar42._4_4_ = fVar212 * fStack_114;
      auVar42._0_4_ = fVar211 * local_118;
      auVar42._8_4_ = fVar262 * fStack_110;
      auVar42._12_4_ = fVar271 * fStack_10c;
      auVar42._16_4_ = fVar272 * fStack_108;
      auVar42._20_4_ = fVar273 * fStack_104;
      auVar42._24_4_ = fVar274 * fStack_100;
      auVar42._28_4_ = fVar192;
      auVar25 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = fVar193 * fStack_574;
      auVar43._0_4_ = fVar156 * local_578;
      auVar43._8_4_ = fVar157 * fStack_570;
      auVar43._12_4_ = fVar194 * fStack_56c;
      auVar43._16_4_ = fVar158 * fStack_568;
      auVar43._20_4_ = fVar195 * fStack_564;
      auVar43._24_4_ = fVar210 * fStack_560;
      auVar43._28_4_ = fVar192;
      auVar44._4_4_ = fVar212 * (float)local_5b8._4_4_;
      auVar44._0_4_ = fVar211 * (float)local_5b8._0_4_;
      auVar44._8_4_ = fVar262 * fStack_5b0;
      auVar44._12_4_ = fVar271 * fStack_5ac;
      auVar44._16_4_ = fVar272 * fStack_5a8;
      auVar44._20_4_ = fVar273 * fStack_5a4;
      auVar44._24_4_ = fVar274 * fStack_5a0;
      auVar44._28_4_ = auVar19._28_4_;
      auVar89 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = local_f8._4_4_ * fVar193;
      auVar45._0_4_ = local_f8._0_4_ * fVar156;
      auVar45._8_4_ = local_f8._8_4_ * fVar157;
      auVar45._12_4_ = local_f8._12_4_ * fVar194;
      auVar45._16_4_ = local_f8._16_4_ * fVar158;
      auVar45._20_4_ = local_f8._20_4_ * fVar195;
      auVar45._24_4_ = local_f8._24_4_ * fVar210;
      auVar45._28_4_ = auVar19._28_4_;
      auVar46._4_4_ = auVar87._4_4_ * fVar212;
      auVar46._0_4_ = auVar87._0_4_ * fVar211;
      auVar46._8_4_ = auVar87._8_4_ * fVar262;
      auVar46._12_4_ = auVar87._12_4_ * fVar271;
      auVar46._16_4_ = auVar87._16_4_ * fVar272;
      auVar46._20_4_ = auVar87._20_4_ * fVar273;
      uVar6 = auVar87._28_4_;
      auVar46._24_4_ = auVar87._24_4_ * fVar274;
      auVar46._28_4_ = uVar6;
      auVar87 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = auVar245._4_4_ * fVar193;
      auVar47._0_4_ = auVar245._0_4_ * fVar156;
      auVar47._8_4_ = auVar245._8_4_ * fVar157;
      auVar47._12_4_ = auVar245._12_4_ * fVar194;
      auVar47._16_4_ = auVar245._16_4_ * fVar158;
      auVar47._20_4_ = auVar245._20_4_ * fVar195;
      auVar47._24_4_ = auVar245._24_4_ * fVar210;
      auVar47._28_4_ = uVar6;
      auVar48._4_4_ = auVar224._4_4_ * fVar212;
      auVar48._0_4_ = auVar224._0_4_ * fVar211;
      auVar48._8_4_ = auVar224._8_4_ * fVar262;
      auVar48._12_4_ = auVar224._12_4_ * fVar271;
      auVar48._16_4_ = auVar224._16_4_ * fVar272;
      auVar48._20_4_ = auVar224._20_4_ * fVar273;
      auVar48._24_4_ = auVar224._24_4_ * fVar274;
      auVar48._28_4_ = auVar224._28_4_;
      auVar116 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar193 * fStack_174;
      auVar49._0_4_ = fVar156 * local_178;
      auVar49._8_4_ = fVar157 * fStack_170;
      auVar49._12_4_ = fVar194 * fStack_16c;
      auVar49._16_4_ = fVar158 * fStack_168;
      auVar49._20_4_ = fVar195 * fStack_164;
      auVar49._24_4_ = fVar210 * fStack_160;
      auVar49._28_4_ = uVar6;
      auVar50._4_4_ = fVar212 * fStack_154;
      auVar50._0_4_ = fVar211 * local_158;
      auVar50._8_4_ = fVar262 * fStack_150;
      auVar50._12_4_ = fVar271 * fStack_14c;
      auVar50._16_4_ = fVar272 * fStack_148;
      auVar50._20_4_ = fVar273 * fStack_144;
      auVar50._24_4_ = fVar274 * fStack_140;
      auVar50._28_4_ = auVar245._28_4_;
      auVar26 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar193 * local_b8._4_4_;
      auVar51._0_4_ = fVar156 * local_b8._0_4_;
      auVar51._8_4_ = fVar157 * local_b8._8_4_;
      auVar51._12_4_ = fVar194 * local_b8._12_4_;
      auVar51._16_4_ = fVar158 * local_b8._16_4_;
      auVar51._20_4_ = fVar195 * local_b8._20_4_;
      auVar51._24_4_ = fVar210 * local_b8._24_4_;
      auVar51._28_4_ = auVar245._28_4_;
      auVar52._4_4_ = fStack_4c4 * fVar212;
      auVar52._0_4_ = local_4c8 * fVar211;
      auVar52._8_4_ = fStack_4c0 * fVar262;
      auVar52._12_4_ = fStack_4bc * fVar271;
      auVar52._16_4_ = fStack_4b8 * fVar272;
      auVar52._20_4_ = fStack_4b4 * fVar273;
      auVar52._24_4_ = fStack_4b0 * fVar274;
      auVar52._28_4_ = local_f8._28_4_;
      auVar27 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar193 * auVar24._4_4_;
      auVar53._0_4_ = fVar156 * auVar24._0_4_;
      auVar53._8_4_ = fVar157 * auVar24._8_4_;
      auVar53._12_4_ = fVar194 * auVar24._12_4_;
      auVar53._16_4_ = fVar158 * auVar24._16_4_;
      auVar53._20_4_ = fVar195 * auVar24._20_4_;
      auVar53._24_4_ = fVar210 * auVar24._24_4_;
      auVar53._28_4_ = auVar21._28_4_ + auVar22._28_4_;
      auVar54._4_4_ = auVar88._4_4_ * fVar212;
      auVar54._0_4_ = auVar88._0_4_ * fVar211;
      auVar54._8_4_ = auVar88._8_4_ * fVar262;
      auVar54._12_4_ = auVar88._12_4_ * fVar271;
      auVar54._16_4_ = auVar88._16_4_ * fVar272;
      auVar54._20_4_ = auVar88._20_4_ * fVar273;
      auVar54._24_4_ = auVar88._24_4_ * fVar274;
      auVar54._28_4_ = auVar20._28_4_ + fVar192;
      auVar88 = vsubps_avx(auVar53,auVar54);
      auVar22 = vminps_avx(auVar23,auVar25);
      auVar21 = vmaxps_avx(auVar23,auVar25);
      auVar19 = vminps_avx(auVar89,auVar87);
      auVar19 = vminps_avx(auVar22,auVar19);
      auVar22 = vmaxps_avx(auVar89,auVar87);
      auVar21 = vmaxps_avx(auVar21,auVar22);
      auVar20 = vminps_avx(auVar116,auVar26);
      auVar22 = vmaxps_avx(auVar116,auVar26);
      auVar87 = vminps_avx(auVar27,auVar88);
      auVar20 = vminps_avx(auVar20,auVar87);
      auVar20 = vminps_avx(auVar19,auVar20);
      auVar19 = vmaxps_avx(auVar27,auVar88);
      auVar22 = vmaxps_avx(auVar22,auVar19);
      auVar22 = vmaxps_avx(auVar21,auVar22);
      auVar21 = vcmpps_avx(auVar20,local_78,2);
      auVar22 = vcmpps_avx(auVar22,local_98,5);
      auVar21 = vandps_avx(auVar22,auVar21);
      auVar86 = vandps_avx(local_198,auVar86);
      auVar22 = auVar86 & auVar21;
      if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar22 >> 0x7f,0) != '\0') ||
            (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0xbf,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar22[0x1f] < '\0') {
        auVar86 = vandps_avx(auVar21,auVar86);
        uVar58 = vmovmskps_avx(auVar86);
        if (uVar58 != 0) {
          mask_stack[uVar61] = uVar58 & 0xff;
          BVar7 = (BBox1f)vmovlps_avx(auVar150);
          cu_stack[uVar61] = BVar7;
          BVar7 = (BBox1f)vmovlps_avx(auVar149);
          cv_stack[uVar61] = BVar7;
          uVar61 = (ulong)((int)uVar61 + 1);
        }
      }
    }
LAB_007a0753:
    do {
      do {
        do {
          do {
            if ((int)uVar61 == 0) {
              uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar85._4_4_ = uVar6;
              auVar85._0_4_ = uVar6;
              auVar85._8_4_ = uVar6;
              auVar85._12_4_ = uVar6;
              auVar219 = vcmpps_avx(auVar148,auVar85,2);
              uVar57 = vmovmskps_avx(auVar219);
              uVar57 = (uint)uVar62 & uVar57;
              goto LAB_0079f8d8;
            }
            uVar60 = (int)uVar61 - 1;
            uVar58 = mask_stack[uVar60];
            fVar192 = cu_stack[uVar60].lower;
            fVar156 = cu_stack[uVar60].upper;
            auVar296._8_8_ = 0;
            auVar296._0_4_ = cv_stack[uVar60].lower;
            auVar296._4_4_ = cv_stack[uVar60].upper;
            auVar300 = ZEXT1664(auVar296);
            uVar15 = 0;
            if (uVar58 != 0) {
              for (; (uVar58 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar58 = uVar58 - 1 & uVar58;
            mask_stack[uVar60] = uVar58;
            if (uVar58 == 0) {
              uVar61 = (ulong)uVar60;
            }
            fVar157 = (float)(uVar15 + 1) * 0.14285715;
            fVar193 = (1.0 - (float)uVar15 * 0.14285715) * fVar192 +
                      fVar156 * (float)uVar15 * 0.14285715;
            fVar192 = (1.0 - fVar157) * fVar192 + fVar156 * fVar157;
            fVar156 = fVar192 - fVar193;
            if (0.16666667 <= fVar156) {
              auVar73 = vinsertps_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar192),0x10);
              auVar307 = ZEXT1664(auVar73);
              goto LAB_007a00fb;
            }
            auVar73 = vshufps_avx(auVar296,auVar296,0x50);
            auVar100._8_4_ = 0x3f800000;
            auVar100._0_8_ = 0x3f8000003f800000;
            auVar100._12_4_ = 0x3f800000;
            auVar234 = vsubps_avx(auVar100,auVar73);
            fVar157 = auVar73._0_4_;
            fVar194 = auVar73._4_4_;
            fVar158 = auVar73._8_4_;
            fVar195 = auVar73._12_4_;
            fVar210 = auVar234._0_4_;
            fVar211 = auVar234._4_4_;
            fVar212 = auVar234._8_4_;
            fVar262 = auVar234._12_4_;
            auVar126._0_4_ = auVar276._0_4_ * fVar157 + fVar210 * fVar252;
            auVar126._4_4_ = auVar276._4_4_ * fVar194 + fVar211 * fVar260;
            auVar126._8_4_ = auVar276._0_4_ * fVar158 + fVar212 * fVar252;
            auVar126._12_4_ = auVar276._4_4_ * fVar195 + fVar262 * fVar260;
            auVar164._0_4_ = auVar240._0_4_ * fVar157 + fVar210 * fVar259;
            auVar164._4_4_ = auVar240._4_4_ * fVar194 + fVar211 * fVar261;
            auVar164._8_4_ = auVar240._0_4_ * fVar158 + fVar212 * fVar259;
            auVar164._12_4_ = auVar240._4_4_ * fVar195 + fVar262 * fVar261;
            auVar184._0_4_ = auVar99._0_4_ * fVar157 + auVar305._0_4_ * fVar210;
            auVar184._4_4_ = auVar99._4_4_ * fVar194 + auVar305._4_4_ * fVar211;
            auVar184._8_4_ = auVar99._0_4_ * fVar158 + auVar305._0_4_ * fVar212;
            auVar184._12_4_ = auVar99._4_4_ * fVar195 + auVar305._4_4_ * fVar262;
            auVar70._0_4_ = auVar68._0_4_ * fVar157 + auVar288._0_4_ * fVar210;
            auVar70._4_4_ = auVar68._4_4_ * fVar194 + auVar288._4_4_ * fVar211;
            auVar70._8_4_ = auVar68._0_4_ * fVar158 + auVar288._0_4_ * fVar212;
            auVar70._12_4_ = auVar68._4_4_ * fVar195 + auVar288._4_4_ * fVar262;
            auVar117._16_16_ = auVar126;
            auVar117._0_16_ = auVar126;
            auVar143._16_16_ = auVar164;
            auVar143._0_16_ = auVar164;
            auVar175._16_16_ = auVar184;
            auVar175._0_16_ = auVar184;
            auVar86 = ZEXT2032(CONCAT416(fVar192,ZEXT416((uint)fVar193)));
            auVar86 = vshufps_avx(auVar86,auVar86,0);
            auVar21 = vsubps_avx(auVar143,auVar117);
            fVar157 = auVar86._0_4_;
            fVar194 = auVar86._4_4_;
            fVar158 = auVar86._8_4_;
            fVar195 = auVar86._12_4_;
            fVar210 = auVar86._16_4_;
            fVar211 = auVar86._20_4_;
            fVar212 = auVar86._24_4_;
            auVar118._0_4_ = auVar126._0_4_ + auVar21._0_4_ * fVar157;
            auVar118._4_4_ = auVar126._4_4_ + auVar21._4_4_ * fVar194;
            auVar118._8_4_ = auVar126._8_4_ + auVar21._8_4_ * fVar158;
            auVar118._12_4_ = auVar126._12_4_ + auVar21._12_4_ * fVar195;
            auVar118._16_4_ = auVar126._0_4_ + auVar21._16_4_ * fVar210;
            auVar118._20_4_ = auVar126._4_4_ + auVar21._20_4_ * fVar211;
            auVar118._24_4_ = auVar126._8_4_ + auVar21._24_4_ * fVar212;
            auVar118._28_4_ = auVar126._12_4_ + auVar21._28_4_;
            auVar86 = vsubps_avx(auVar175,auVar143);
            auVar144._0_4_ = auVar164._0_4_ + auVar86._0_4_ * fVar157;
            auVar144._4_4_ = auVar164._4_4_ + auVar86._4_4_ * fVar194;
            auVar144._8_4_ = auVar164._8_4_ + auVar86._8_4_ * fVar158;
            auVar144._12_4_ = auVar164._12_4_ + auVar86._12_4_ * fVar195;
            auVar144._16_4_ = auVar164._0_4_ + auVar86._16_4_ * fVar210;
            auVar144._20_4_ = auVar164._4_4_ + auVar86._20_4_ * fVar211;
            auVar144._24_4_ = auVar164._8_4_ + auVar86._24_4_ * fVar212;
            auVar144._28_4_ = auVar164._12_4_ + auVar86._28_4_;
            auVar73 = vsubps_avx(auVar70,auVar184);
            auVar90._0_4_ = auVar184._0_4_ + auVar73._0_4_ * fVar157;
            auVar90._4_4_ = auVar184._4_4_ + auVar73._4_4_ * fVar194;
            auVar90._8_4_ = auVar184._8_4_ + auVar73._8_4_ * fVar158;
            auVar90._12_4_ = auVar184._12_4_ + auVar73._12_4_ * fVar195;
            auVar90._16_4_ = auVar184._0_4_ + auVar73._0_4_ * fVar210;
            auVar90._20_4_ = auVar184._4_4_ + auVar73._4_4_ * fVar211;
            auVar90._24_4_ = auVar184._8_4_ + auVar73._8_4_ * fVar212;
            auVar90._28_4_ = auVar184._12_4_ + auVar73._12_4_;
            auVar86 = vsubps_avx(auVar144,auVar118);
            auVar119._0_4_ = auVar118._0_4_ + fVar157 * auVar86._0_4_;
            auVar119._4_4_ = auVar118._4_4_ + fVar194 * auVar86._4_4_;
            auVar119._8_4_ = auVar118._8_4_ + fVar158 * auVar86._8_4_;
            auVar119._12_4_ = auVar118._12_4_ + fVar195 * auVar86._12_4_;
            auVar119._16_4_ = auVar118._16_4_ + fVar210 * auVar86._16_4_;
            auVar119._20_4_ = auVar118._20_4_ + fVar211 * auVar86._20_4_;
            auVar119._24_4_ = auVar118._24_4_ + fVar212 * auVar86._24_4_;
            auVar119._28_4_ = auVar118._28_4_ + auVar86._28_4_;
            auVar86 = vsubps_avx(auVar90,auVar144);
            auVar91._0_4_ = auVar144._0_4_ + fVar157 * auVar86._0_4_;
            auVar91._4_4_ = auVar144._4_4_ + fVar194 * auVar86._4_4_;
            auVar91._8_4_ = auVar144._8_4_ + fVar158 * auVar86._8_4_;
            auVar91._12_4_ = auVar144._12_4_ + fVar195 * auVar86._12_4_;
            auVar91._16_4_ = auVar144._16_4_ + fVar210 * auVar86._16_4_;
            auVar91._20_4_ = auVar144._20_4_ + fVar211 * auVar86._20_4_;
            auVar91._24_4_ = auVar144._24_4_ + fVar212 * auVar86._24_4_;
            auVar91._28_4_ = auVar144._28_4_ + auVar86._28_4_;
            auVar86 = vsubps_avx(auVar91,auVar119);
            auVar204._0_4_ = auVar119._0_4_ + fVar157 * auVar86._0_4_;
            auVar204._4_4_ = auVar119._4_4_ + fVar194 * auVar86._4_4_;
            auVar204._8_4_ = auVar119._8_4_ + fVar158 * auVar86._8_4_;
            auVar204._12_4_ = auVar119._12_4_ + fVar195 * auVar86._12_4_;
            auVar209._16_4_ = auVar119._16_4_ + fVar210 * auVar86._16_4_;
            auVar209._0_16_ = auVar204;
            auVar209._20_4_ = auVar119._20_4_ + fVar211 * auVar86._20_4_;
            auVar209._24_4_ = auVar119._24_4_ + fVar212 * auVar86._24_4_;
            auVar209._28_4_ = auVar119._28_4_ + auVar144._28_4_;
            auVar98 = auVar209._16_16_;
            auVar102 = vshufps_avx(ZEXT416((uint)(fVar156 * 0.33333334)),
                                   ZEXT416((uint)(fVar156 * 0.33333334)),0);
            auVar165._0_4_ = auVar204._0_4_ + auVar102._0_4_ * auVar86._0_4_ * 3.0;
            auVar165._4_4_ = auVar204._4_4_ + auVar102._4_4_ * auVar86._4_4_ * 3.0;
            auVar165._8_4_ = auVar204._8_4_ + auVar102._8_4_ * auVar86._8_4_ * 3.0;
            auVar165._12_4_ = auVar204._12_4_ + auVar102._12_4_ * auVar86._12_4_ * 3.0;
            auVar142 = vshufpd_avx(auVar204,auVar204,3);
            auVar113 = vshufpd_avx(auVar98,auVar98,3);
            auVar73 = vsubps_avx(auVar142,auVar204);
            auVar234 = vsubps_avx(auVar113,auVar98);
            auVar71._0_4_ = auVar73._0_4_ + auVar234._0_4_;
            auVar71._4_4_ = auVar73._4_4_ + auVar234._4_4_;
            auVar71._8_4_ = auVar73._8_4_ + auVar234._8_4_;
            auVar71._12_4_ = auVar73._12_4_ + auVar234._12_4_;
            auVar73 = vmovshdup_avx(auVar204);
            auVar234 = vmovshdup_avx(auVar165);
            auVar128 = vshufps_avx(auVar71,auVar71,0);
            auVar69 = vshufps_avx(auVar71,auVar71,0x55);
            fVar157 = auVar69._0_4_;
            fVar194 = auVar69._4_4_;
            fVar158 = auVar69._8_4_;
            fVar195 = auVar69._12_4_;
            fVar210 = auVar128._0_4_;
            fVar211 = auVar128._4_4_;
            fVar212 = auVar128._8_4_;
            fVar262 = auVar128._12_4_;
            auVar72._0_4_ = fVar210 * auVar204._0_4_ + auVar73._0_4_ * fVar157;
            auVar72._4_4_ = fVar211 * auVar204._4_4_ + auVar73._4_4_ * fVar194;
            auVar72._8_4_ = fVar212 * auVar204._8_4_ + auVar73._8_4_ * fVar158;
            auVar72._12_4_ = fVar262 * auVar204._12_4_ + auVar73._12_4_ * fVar195;
            auVar266._0_4_ = fVar210 * auVar165._0_4_ + auVar234._0_4_ * fVar157;
            auVar266._4_4_ = fVar211 * auVar165._4_4_ + auVar234._4_4_ * fVar194;
            auVar266._8_4_ = fVar212 * auVar165._8_4_ + auVar234._8_4_ * fVar158;
            auVar266._12_4_ = fVar262 * auVar165._12_4_ + auVar234._12_4_ * fVar195;
            auVar234 = vshufps_avx(auVar72,auVar72,0xe8);
            auVar128 = vshufps_avx(auVar266,auVar266,0xe8);
            auVar73 = vcmpps_avx(auVar234,auVar128,1);
            uVar58 = vextractps_avx(auVar73,0);
            auVar69 = auVar266;
            if ((uVar58 & 1) == 0) {
              auVar69 = auVar72;
            }
            auVar101._0_4_ = auVar102._0_4_ * auVar86._16_4_ * 3.0;
            auVar101._4_4_ = auVar102._4_4_ * auVar86._20_4_ * 3.0;
            auVar101._8_4_ = auVar102._8_4_ * auVar86._24_4_ * 3.0;
            auVar101._12_4_ = auVar102._12_4_ * 0.0;
            auVar124 = vsubps_avx(auVar98,auVar101);
            auVar102 = vmovshdup_avx(auVar124);
            auVar98 = vmovshdup_avx(auVar98);
            fVar271 = auVar124._0_4_;
            fVar272 = auVar124._4_4_;
            auVar185._0_4_ = fVar271 * fVar210 + auVar102._0_4_ * fVar157;
            auVar185._4_4_ = fVar272 * fVar211 + auVar102._4_4_ * fVar194;
            auVar185._8_4_ = auVar124._8_4_ * fVar212 + auVar102._8_4_ * fVar158;
            auVar185._12_4_ = auVar124._12_4_ * fVar262 + auVar102._12_4_ * fVar195;
            auVar306._0_4_ = fVar210 * auVar209._16_4_ + auVar98._0_4_ * fVar157;
            auVar306._4_4_ = fVar211 * auVar209._20_4_ + auVar98._4_4_ * fVar194;
            auVar306._8_4_ = fVar212 * auVar209._24_4_ + auVar98._8_4_ * fVar158;
            auVar306._12_4_ = fVar262 * auVar209._28_4_ + auVar98._12_4_ * fVar195;
            auVar98 = vshufps_avx(auVar185,auVar185,0xe8);
            auVar123 = vshufps_avx(auVar306,auVar306,0xe8);
            auVar102 = vcmpps_avx(auVar98,auVar123,1);
            uVar58 = vextractps_avx(auVar102,0);
            auVar149 = auVar306;
            if ((uVar58 & 1) == 0) {
              auVar149 = auVar185;
            }
            auVar69 = vmaxss_avx(auVar149,auVar69);
            auVar234 = vminps_avx(auVar234,auVar128);
            auVar128 = vminps_avx(auVar98,auVar123);
            auVar128 = vminps_avx(auVar234,auVar128);
            auVar73 = vshufps_avx(auVar73,auVar73,0x55);
            auVar73 = vblendps_avx(auVar73,auVar102,2);
            auVar102 = vpslld_avx(auVar73,0x1f);
            auVar73 = vshufpd_avx(auVar266,auVar266,1);
            auVar73 = vinsertps_avx(auVar73,auVar306,0x9c);
            auVar234 = vshufpd_avx(auVar72,auVar72,1);
            auVar234 = vinsertps_avx(auVar234,auVar185,0x9c);
            auVar73 = vblendvps_avx(auVar234,auVar73,auVar102);
            auVar234 = vmovshdup_avx(auVar73);
            auVar73 = vmaxss_avx(auVar234,auVar73);
            fVar158 = auVar128._0_4_;
            auVar234 = vmovshdup_avx(auVar128);
            fVar194 = auVar73._0_4_;
            fVar195 = auVar234._0_4_;
            fVar157 = auVar69._0_4_;
            if ((fVar158 < 0.0001) && (-0.0001 < fVar194)) break;
            if ((fVar195 < 0.0001 && -0.0001 < fVar157) || (fVar158 < 0.0001 && -0.0001 < fVar157))
            break;
            auVar102 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar73,1);
            auVar234 = vcmpps_avx(auVar234,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar234 = vandps_avx(auVar234,auVar102);
          } while ((auVar234 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar102 = vcmpps_avx(auVar128,_DAT_01f45a50,1);
          auVar234 = vcmpss_avx(auVar69,ZEXT416(0) << 0x20,1);
          auVar127._8_4_ = 0x3f800000;
          auVar127._0_8_ = 0x3f8000003f800000;
          auVar127._12_4_ = 0x3f800000;
          auVar166._8_4_ = 0xbf800000;
          auVar166._0_8_ = 0xbf800000bf800000;
          auVar166._12_4_ = 0xbf800000;
          auVar234 = vblendvps_avx(auVar127,auVar166,auVar234);
          auVar102 = vblendvps_avx(auVar127,auVar166,auVar102);
          auVar128 = vcmpss_avx(auVar102,auVar234,4);
          auVar128 = vpshufd_avx(ZEXT416(auVar128._0_4_ & 1),0x50);
          auVar128 = vpslld_avx(auVar128,0x1f);
          auVar128 = vpsrad_avx(auVar128,0x1f);
          auVar128 = vpandn_avx(auVar128,_DAT_01f7afb0);
          auVar69 = vmovshdup_avx(auVar102);
          fVar210 = auVar69._0_4_;
          if ((auVar102._0_4_ != fVar210) || (NAN(auVar102._0_4_) || NAN(fVar210))) {
            if ((fVar195 != fVar158) || (NAN(fVar195) || NAN(fVar158))) {
              fVar158 = -fVar158 / (fVar195 - fVar158);
              auVar102 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar158) * 0.0 + fVar158)));
            }
            else {
              auVar102 = ZEXT816(0x3f80000000000000);
              if ((fVar158 != 0.0) || (NAN(fVar158))) {
                auVar102 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar98 = vcmpps_avx(auVar128,auVar102,1);
            auVar69 = vblendps_avx(auVar128,auVar102,2);
            auVar102 = vblendps_avx(auVar102,auVar128,2);
            auVar128 = vblendvps_avx(auVar102,auVar69,auVar98);
          }
          auVar73 = vcmpss_avx(auVar73,ZEXT416(0) << 0x20,1);
          auVar129._8_4_ = 0x3f800000;
          auVar129._0_8_ = 0x3f8000003f800000;
          auVar129._12_4_ = 0x3f800000;
          auVar167._8_4_ = 0xbf800000;
          auVar167._0_8_ = 0xbf800000bf800000;
          auVar167._12_4_ = 0xbf800000;
          auVar73 = vblendvps_avx(auVar129,auVar167,auVar73);
          fVar158 = auVar73._0_4_;
          if ((auVar234._0_4_ != fVar158) || (NAN(auVar234._0_4_) || NAN(fVar158))) {
            if ((fVar194 != fVar157) || (NAN(fVar194) || NAN(fVar157))) {
              fVar157 = -fVar157 / (fVar194 - fVar157);
              auVar73 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar157) * 0.0 + fVar157)));
            }
            else {
              auVar73 = ZEXT816(0x3f80000000000000);
              if ((fVar157 != 0.0) || (NAN(fVar157))) {
                auVar73 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar102 = vcmpps_avx(auVar128,auVar73,1);
            auVar234 = vblendps_avx(auVar128,auVar73,2);
            auVar73 = vblendps_avx(auVar73,auVar128,2);
            auVar128 = vblendvps_avx(auVar73,auVar234,auVar102);
          }
          if ((fVar210 != fVar158) || (NAN(fVar210) || NAN(fVar158))) {
            auVar74._8_4_ = 0x3f800000;
            auVar74._0_8_ = 0x3f8000003f800000;
            auVar74._12_4_ = 0x3f800000;
            auVar73 = vcmpps_avx(auVar128,auVar74,1);
            auVar234 = vinsertps_avx(auVar128,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar130._4_12_ = auVar128._4_12_;
            auVar130._0_4_ = 0x3f800000;
            auVar128 = vblendvps_avx(auVar130,auVar234,auVar73);
          }
          auVar73 = vcmpps_avx(auVar128,_DAT_01f46740,1);
          auVar56._12_4_ = 0;
          auVar56._0_12_ = auVar128._4_12_;
          auVar234 = vinsertps_avx(auVar128,ZEXT416(0x3f800000),0x10);
          auVar73 = vblendvps_avx(auVar234,auVar56 << 0x20,auVar73);
          auVar234 = vmovshdup_avx(auVar73);
        } while (auVar234._0_4_ < auVar73._0_4_);
        auVar75._0_4_ = auVar73._0_4_ + -0.1;
        auVar75._4_4_ = auVar73._4_4_ + 0.1;
        auVar75._8_4_ = auVar73._8_4_ + 0.0;
        auVar75._12_4_ = auVar73._12_4_ + 0.0;
        auVar102 = vshufpd_avx(auVar165,auVar165,3);
        auVar205._8_8_ = 0x3f80000000000000;
        auVar205._0_8_ = 0x3f80000000000000;
        auVar73 = vcmpps_avx(auVar75,auVar205,1);
        auVar55._12_4_ = 0;
        auVar55._0_12_ = auVar75._4_12_;
        auVar234 = vinsertps_avx(auVar75,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar73 = vblendvps_avx(auVar234,auVar55 << 0x20,auVar73);
        auVar234 = vshufpd_avx(auVar124,auVar124,3);
        auVar128 = vshufps_avx(auVar73,auVar73,0x50);
        auVar206._8_4_ = 0x3f800000;
        auVar206._0_8_ = 0x3f8000003f800000;
        auVar206._12_4_ = 0x3f800000;
        auVar69 = vsubps_avx(auVar206,auVar128);
        local_3d8 = auVar142._0_4_;
        fStack_3d4 = auVar142._4_4_;
        fStack_3d0 = auVar142._8_4_;
        fStack_3cc = auVar142._12_4_;
        fVar157 = auVar128._0_4_;
        fVar194 = auVar128._4_4_;
        fVar158 = auVar128._8_4_;
        fVar195 = auVar128._12_4_;
        local_598 = auVar113._0_4_;
        fStack_594 = auVar113._4_4_;
        fStack_590 = auVar113._8_4_;
        fStack_58c = auVar113._12_4_;
        fVar210 = auVar69._0_4_;
        fVar211 = auVar69._4_4_;
        fVar212 = auVar69._8_4_;
        fVar262 = auVar69._12_4_;
        auVar76._0_4_ = fVar157 * local_3d8 + fVar210 * auVar204._0_4_;
        auVar76._4_4_ = fVar194 * fStack_3d4 + fVar211 * auVar204._4_4_;
        auVar76._8_4_ = fVar158 * fStack_3d0 + fVar212 * auVar204._0_4_;
        auVar76._12_4_ = fVar195 * fStack_3cc + fVar262 * auVar204._4_4_;
        auVar186._0_4_ = auVar102._0_4_ * fVar157 + fVar210 * auVar165._0_4_;
        auVar186._4_4_ = auVar102._4_4_ * fVar194 + fVar211 * auVar165._4_4_;
        auVar186._8_4_ = auVar102._8_4_ * fVar158 + fVar212 * auVar165._0_4_;
        auVar186._12_4_ = auVar102._12_4_ * fVar195 + fVar262 * auVar165._4_4_;
        auVar222._0_4_ = auVar234._0_4_ * fVar157 + fVar210 * fVar271;
        auVar222._4_4_ = auVar234._4_4_ * fVar194 + fVar211 * fVar272;
        auVar222._8_4_ = auVar234._8_4_ * fVar158 + fVar212 * fVar271;
        auVar222._12_4_ = auVar234._12_4_ * fVar195 + fVar262 * fVar272;
        auVar255._0_4_ = fVar157 * local_598 + fVar210 * auVar209._16_4_;
        auVar255._4_4_ = fVar194 * fStack_594 + fVar211 * auVar209._20_4_;
        auVar255._8_4_ = fVar158 * fStack_590 + fVar212 * auVar209._16_4_;
        auVar255._12_4_ = fVar195 * fStack_58c + fVar262 * auVar209._20_4_;
        auVar113 = vsubps_avx(auVar206,auVar73);
        auVar234 = vmovshdup_avx(auVar296);
        auVar142 = vmovsldup_avx(auVar296);
        auVar207._0_4_ = auVar113._0_4_ * auVar142._0_4_ + auVar73._0_4_ * auVar234._0_4_;
        auVar207._4_4_ = auVar113._4_4_ * auVar142._4_4_ + auVar73._4_4_ * auVar234._4_4_;
        auVar207._8_4_ = auVar113._8_4_ * auVar142._8_4_ + auVar73._8_4_ * auVar234._8_4_;
        auVar207._12_4_ = auVar113._12_4_ * auVar142._12_4_ + auVar73._12_4_ * auVar234._12_4_;
        auVar124 = vmovshdup_avx(auVar207);
        auVar73 = vsubps_avx(auVar186,auVar76);
        auVar131._0_4_ = auVar73._0_4_ * 3.0;
        auVar131._4_4_ = auVar73._4_4_ * 3.0;
        auVar131._8_4_ = auVar73._8_4_ * 3.0;
        auVar131._12_4_ = auVar73._12_4_ * 3.0;
        auVar73 = vsubps_avx(auVar222,auVar186);
        auVar152._0_4_ = auVar73._0_4_ * 3.0;
        auVar152._4_4_ = auVar73._4_4_ * 3.0;
        auVar152._8_4_ = auVar73._8_4_ * 3.0;
        auVar152._12_4_ = auVar73._12_4_ * 3.0;
        auVar73 = vsubps_avx(auVar255,auVar222);
        auVar228._0_4_ = auVar73._0_4_ * 3.0;
        auVar228._4_4_ = auVar73._4_4_ * 3.0;
        auVar228._8_4_ = auVar73._8_4_ * 3.0;
        auVar228._12_4_ = auVar73._12_4_ * 3.0;
        auVar234 = vminps_avx(auVar152,auVar228);
        auVar73 = vmaxps_avx(auVar152,auVar228);
        auVar234 = vminps_avx(auVar131,auVar234);
        auVar73 = vmaxps_avx(auVar131,auVar73);
        auVar142 = vshufpd_avx(auVar234,auVar234,3);
        auVar113 = vshufpd_avx(auVar73,auVar73,3);
        auVar234 = vminps_avx(auVar234,auVar142);
        auVar73 = vmaxps_avx(auVar73,auVar113);
        auVar142 = vshufps_avx(ZEXT416((uint)(1.0 / fVar156)),ZEXT416((uint)(1.0 / fVar156)),0);
        auVar229._0_4_ = auVar142._0_4_ * auVar234._0_4_;
        auVar229._4_4_ = auVar142._4_4_ * auVar234._4_4_;
        auVar229._8_4_ = auVar142._8_4_ * auVar234._8_4_;
        auVar229._12_4_ = auVar142._12_4_ * auVar234._12_4_;
        auVar241._0_4_ = auVar142._0_4_ * auVar73._0_4_;
        auVar241._4_4_ = auVar142._4_4_ * auVar73._4_4_;
        auVar241._8_4_ = auVar142._8_4_ * auVar73._8_4_;
        auVar241._12_4_ = auVar142._12_4_ * auVar73._12_4_;
        auVar69 = ZEXT416((uint)(1.0 / (auVar124._0_4_ - auVar207._0_4_)));
        auVar73 = vshufpd_avx(auVar76,auVar76,3);
        auVar234 = vshufpd_avx(auVar186,auVar186,3);
        auVar142 = vshufpd_avx(auVar222,auVar222,3);
        auVar113 = vshufpd_avx(auVar255,auVar255,3);
        auVar73 = vsubps_avx(auVar73,auVar76);
        auVar102 = vsubps_avx(auVar234,auVar186);
        auVar128 = vsubps_avx(auVar142,auVar222);
        auVar113 = vsubps_avx(auVar113,auVar255);
        auVar234 = vminps_avx(auVar73,auVar102);
        auVar73 = vmaxps_avx(auVar73,auVar102);
        auVar142 = vminps_avx(auVar128,auVar113);
        auVar142 = vminps_avx(auVar234,auVar142);
        auVar234 = vmaxps_avx(auVar128,auVar113);
        auVar73 = vmaxps_avx(auVar73,auVar234);
        auVar234 = vshufps_avx(auVar69,auVar69,0);
        auVar289._0_4_ = auVar234._0_4_ * auVar142._0_4_;
        auVar289._4_4_ = auVar234._4_4_ * auVar142._4_4_;
        auVar289._8_4_ = auVar234._8_4_ * auVar142._8_4_;
        auVar289._12_4_ = auVar234._12_4_ * auVar142._12_4_;
        auVar297._0_4_ = auVar234._0_4_ * auVar73._0_4_;
        auVar297._4_4_ = auVar234._4_4_ * auVar73._4_4_;
        auVar297._8_4_ = auVar234._8_4_ * auVar73._8_4_;
        auVar297._12_4_ = auVar234._12_4_ * auVar73._12_4_;
        auVar73 = vmovsldup_avx(auVar207);
        auVar256._4_12_ = auVar73._4_12_;
        auVar256._0_4_ = fVar193;
        auVar267._4_12_ = auVar207._4_12_;
        auVar267._0_4_ = fVar192;
        auVar153._0_4_ = (fVar193 + fVar192) * 0.5;
        auVar153._4_4_ = (auVar73._4_4_ + auVar207._4_4_) * 0.5;
        auVar153._8_4_ = (auVar73._8_4_ + auVar207._8_4_) * 0.5;
        auVar153._12_4_ = (auVar73._12_4_ + auVar207._12_4_) * 0.5;
        auVar73 = vshufps_avx(auVar153,auVar153,0);
        local_258 = auVar16._0_4_;
        fStack_254 = auVar16._4_4_;
        fStack_250 = auVar16._8_4_;
        fStack_24c = auVar16._12_4_;
        fVar157 = auVar73._0_4_;
        fVar194 = auVar73._4_4_;
        fVar158 = auVar73._8_4_;
        fVar195 = auVar73._12_4_;
        p00.field_0.i[0] = auVar17._0_4_;
        p00.field_0.i[1] = auVar17._4_4_;
        p00.field_0.i[2] = auVar17._8_4_;
        p00.field_0.i[3] = auVar17._12_4_;
        auVar103._0_4_ = fVar157 * local_258 + p00.field_0.v[0];
        auVar103._4_4_ = fVar194 * fStack_254 + p00.field_0.v[1];
        auVar103._8_4_ = fVar158 * fStack_250 + p00.field_0.v[2];
        auVar103._12_4_ = fVar195 * fStack_24c + p00.field_0.v[3];
        local_268 = auVar177._0_4_;
        fStack_264 = auVar177._4_4_;
        fStack_260 = auVar177._8_4_;
        fStack_25c = auVar177._12_4_;
        p01.field_0.i[0] = auVar265._0_4_;
        p01.field_0.i[1] = auVar265._4_4_;
        p01.field_0.i[2] = auVar265._8_4_;
        p01.field_0.i[3] = auVar265._12_4_;
        auVar132._0_4_ = fVar157 * local_268 + p01.field_0.v[0];
        auVar132._4_4_ = fVar194 * fStack_264 + p01.field_0.v[1];
        auVar132._8_4_ = fVar158 * fStack_260 + p01.field_0.v[2];
        auVar132._12_4_ = fVar195 * fStack_25c + p01.field_0.v[3];
        local_278 = auVar178._0_4_;
        fStack_274 = auVar178._4_4_;
        fStack_270 = auVar178._8_4_;
        fStack_26c = auVar178._12_4_;
        p02.field_0.i[0] = auVar18._0_4_;
        p02.field_0.i[1] = auVar18._4_4_;
        p02.field_0.i[2] = auVar18._8_4_;
        p02.field_0.i[3] = auVar18._12_4_;
        auVar187._0_4_ = fVar157 * local_278 + p02.field_0.v[0];
        auVar187._4_4_ = fVar194 * fStack_274 + p02.field_0.v[1];
        auVar187._8_4_ = fVar158 * fStack_270 + p02.field_0.v[2];
        auVar187._12_4_ = fVar195 * fStack_26c + p02.field_0.v[3];
        auVar73 = vsubps_avx(auVar132,auVar103);
        auVar104._0_4_ = auVar103._0_4_ + fVar157 * auVar73._0_4_;
        auVar104._4_4_ = auVar103._4_4_ + fVar194 * auVar73._4_4_;
        auVar104._8_4_ = auVar103._8_4_ + fVar158 * auVar73._8_4_;
        auVar104._12_4_ = auVar103._12_4_ + fVar195 * auVar73._12_4_;
        auVar73 = vsubps_avx(auVar187,auVar132);
        auVar133._0_4_ = auVar132._0_4_ + fVar157 * auVar73._0_4_;
        auVar133._4_4_ = auVar132._4_4_ + fVar194 * auVar73._4_4_;
        auVar133._8_4_ = auVar132._8_4_ + fVar158 * auVar73._8_4_;
        auVar133._12_4_ = auVar132._12_4_ + fVar195 * auVar73._12_4_;
        auVar73 = vsubps_avx(auVar133,auVar104);
        fVar157 = auVar104._0_4_ + fVar157 * auVar73._0_4_;
        fVar194 = auVar104._4_4_ + fVar194 * auVar73._4_4_;
        auVar77._0_8_ = CONCAT44(fVar194,fVar157);
        auVar77._8_4_ = auVar104._8_4_ + fVar158 * auVar73._8_4_;
        auVar77._12_4_ = auVar104._12_4_ + fVar195 * auVar73._12_4_;
        fVar158 = auVar73._0_4_ * 3.0;
        fVar195 = auVar73._4_4_ * 3.0;
        auVar105._0_8_ = CONCAT44(fVar195,fVar158);
        auVar105._8_4_ = auVar73._8_4_ * 3.0;
        auVar105._12_4_ = auVar73._12_4_ * 3.0;
        auVar134._8_8_ = auVar77._0_8_;
        auVar134._0_8_ = auVar77._0_8_;
        auVar73 = vshufpd_avx(auVar77,auVar77,3);
        auVar234 = vshufps_avx(auVar153,auVar153,0x55);
        auVar128 = vsubps_avx(auVar73,auVar134);
        auVar277._0_4_ = auVar128._0_4_ * auVar234._0_4_ + fVar157;
        auVar277._4_4_ = auVar128._4_4_ * auVar234._4_4_ + fVar194;
        auVar277._8_4_ = auVar128._8_4_ * auVar234._8_4_ + fVar157;
        auVar277._12_4_ = auVar128._12_4_ * auVar234._12_4_ + fVar194;
        auVar135._8_8_ = auVar105._0_8_;
        auVar135._0_8_ = auVar105._0_8_;
        auVar73 = vshufpd_avx(auVar105,auVar105,1);
        auVar73 = vsubps_avx(auVar73,auVar135);
        auVar106._0_4_ = auVar73._0_4_ * auVar234._0_4_ + fVar158;
        auVar106._4_4_ = auVar73._4_4_ * auVar234._4_4_ + fVar195;
        auVar106._8_4_ = auVar73._8_4_ * auVar234._8_4_ + fVar158;
        auVar106._12_4_ = auVar73._12_4_ * auVar234._12_4_ + fVar195;
        auVar234 = vmovshdup_avx(auVar106);
        auVar188._0_8_ = auVar234._0_8_ ^ 0x8000000080000000;
        auVar188._8_4_ = auVar234._8_4_ ^ 0x80000000;
        auVar188._12_4_ = auVar234._12_4_ ^ 0x80000000;
        auVar142 = vmovshdup_avx(auVar128);
        auVar73 = vunpcklps_avx(auVar142,auVar188);
        auVar113 = vshufps_avx(auVar73,auVar188,4);
        auVar78._0_8_ = auVar128._0_8_ ^ 0x8000000080000000;
        auVar78._8_4_ = -auVar128._8_4_;
        auVar78._12_4_ = -auVar128._12_4_;
        auVar73 = vmovlhps_avx(auVar78,auVar106);
        auVar102 = vshufps_avx(auVar73,auVar106,8);
        auVar73 = ZEXT416((uint)(auVar106._0_4_ * auVar142._0_4_ - auVar128._0_4_ * auVar234._0_4_))
        ;
        auVar234 = vshufps_avx(auVar73,auVar73,0);
        auVar73 = vdivps_avx(auVar113,auVar234);
        auVar234 = vdivps_avx(auVar102,auVar234);
        auVar102 = vinsertps_avx(auVar229,auVar289,0x1c);
        auVar128 = vinsertps_avx(auVar241,auVar297,0x1c);
        auVar69 = vinsertps_avx(auVar289,auVar229,0x4c);
        auVar98 = vinsertps_avx(auVar297,auVar241,0x4c);
        auVar142 = vmovsldup_avx(auVar73);
        auVar136._0_4_ = auVar142._0_4_ * auVar102._0_4_;
        auVar136._4_4_ = auVar142._4_4_ * auVar102._4_4_;
        auVar136._8_4_ = auVar142._8_4_ * auVar102._8_4_;
        auVar136._12_4_ = auVar142._12_4_ * auVar102._12_4_;
        auVar107._0_4_ = auVar128._0_4_ * auVar142._0_4_;
        auVar107._4_4_ = auVar128._4_4_ * auVar142._4_4_;
        auVar107._8_4_ = auVar128._8_4_ * auVar142._8_4_;
        auVar107._12_4_ = auVar128._12_4_ * auVar142._12_4_;
        auVar113 = vminps_avx(auVar136,auVar107);
        auVar142 = vmaxps_avx(auVar107,auVar136);
        auVar123 = vmovsldup_avx(auVar234);
        auVar298._0_4_ = auVar69._0_4_ * auVar123._0_4_;
        auVar298._4_4_ = auVar69._4_4_ * auVar123._4_4_;
        auVar298._8_4_ = auVar69._8_4_ * auVar123._8_4_;
        auVar298._12_4_ = auVar69._12_4_ * auVar123._12_4_;
        auVar137._0_4_ = auVar98._0_4_ * auVar123._0_4_;
        auVar137._4_4_ = auVar98._4_4_ * auVar123._4_4_;
        auVar137._8_4_ = auVar98._8_4_ * auVar123._8_4_;
        auVar137._12_4_ = auVar98._12_4_ * auVar123._12_4_;
        auVar123 = vminps_avx(auVar298,auVar137);
        auVar168._0_4_ = auVar113._0_4_ + auVar123._0_4_;
        auVar168._4_4_ = auVar113._4_4_ + auVar123._4_4_;
        auVar168._8_4_ = auVar113._8_4_ + auVar123._8_4_;
        auVar168._12_4_ = auVar113._12_4_ + auVar123._12_4_;
        auVar113 = vmaxps_avx(auVar137,auVar298);
        auVar123 = vsubps_avx(auVar256,auVar153);
        auVar149 = vsubps_avx(auVar267,auVar153);
        auVar108._0_4_ = auVar142._0_4_ + auVar113._0_4_;
        auVar108._4_4_ = auVar142._4_4_ + auVar113._4_4_;
        auVar108._8_4_ = auVar142._8_4_ + auVar113._8_4_;
        auVar108._12_4_ = auVar142._12_4_ + auVar113._12_4_;
        auVar138._8_8_ = 0x3f800000;
        auVar138._0_8_ = 0x3f800000;
        auVar142 = vsubps_avx(auVar138,auVar108);
        auVar113 = vsubps_avx(auVar138,auVar168);
        fVar212 = auVar123._0_4_;
        auVar169._0_4_ = fVar212 * auVar142._0_4_;
        fVar262 = auVar123._4_4_;
        auVar169._4_4_ = fVar262 * auVar142._4_4_;
        fVar271 = auVar123._8_4_;
        auVar169._8_4_ = fVar271 * auVar142._8_4_;
        fVar272 = auVar123._12_4_;
        auVar169._12_4_ = fVar272 * auVar142._12_4_;
        fVar158 = auVar149._0_4_;
        auVar109._0_4_ = fVar158 * auVar142._0_4_;
        fVar195 = auVar149._4_4_;
        auVar109._4_4_ = fVar195 * auVar142._4_4_;
        fVar210 = auVar149._8_4_;
        auVar109._8_4_ = fVar210 * auVar142._8_4_;
        fVar211 = auVar149._12_4_;
        auVar109._12_4_ = fVar211 * auVar142._12_4_;
        auVar268._0_4_ = fVar212 * auVar113._0_4_;
        auVar268._4_4_ = fVar262 * auVar113._4_4_;
        auVar268._8_4_ = fVar271 * auVar113._8_4_;
        auVar268._12_4_ = fVar272 * auVar113._12_4_;
        auVar139._0_4_ = fVar158 * auVar113._0_4_;
        auVar139._4_4_ = fVar195 * auVar113._4_4_;
        auVar139._8_4_ = fVar210 * auVar113._8_4_;
        auVar139._12_4_ = fVar211 * auVar113._12_4_;
        auVar142 = vminps_avx(auVar169,auVar268);
        auVar113 = vminps_avx(auVar109,auVar139);
        auVar123 = vminps_avx(auVar142,auVar113);
        auVar142 = vmaxps_avx(auVar268,auVar169);
        auVar113 = vmaxps_avx(auVar139,auVar109);
        auVar149 = vshufps_avx(auVar153,auVar153,0x54);
        auVar113 = vmaxps_avx(auVar113,auVar142);
        auVar150 = vshufps_avx(auVar277,auVar277,0);
        auVar161 = vshufps_avx(auVar277,auVar277,0x55);
        auVar142 = vhaddps_avx(auVar123,auVar123);
        auVar113 = vhaddps_avx(auVar113,auVar113);
        auVar154._0_4_ = auVar150._0_4_ * auVar73._0_4_ + auVar161._0_4_ * auVar234._0_4_;
        auVar154._4_4_ = auVar150._4_4_ * auVar73._4_4_ + auVar161._4_4_ * auVar234._4_4_;
        auVar154._8_4_ = auVar150._8_4_ * auVar73._8_4_ + auVar161._8_4_ * auVar234._8_4_;
        auVar154._12_4_ = auVar150._12_4_ * auVar73._12_4_ + auVar161._12_4_ * auVar234._12_4_;
        auVar123 = vsubps_avx(auVar149,auVar154);
        fVar157 = auVar123._0_4_ + auVar142._0_4_;
        fVar194 = auVar123._0_4_ + auVar113._0_4_;
        auVar142 = vmaxss_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar157));
        auVar113 = vminss_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar192));
      } while (auVar113._0_4_ < auVar142._0_4_);
      auVar142 = vmovshdup_avx(auVar73);
      auVar79._0_4_ = auVar142._0_4_ * auVar102._0_4_;
      auVar79._4_4_ = auVar142._4_4_ * auVar102._4_4_;
      auVar79._8_4_ = auVar142._8_4_ * auVar102._8_4_;
      auVar79._12_4_ = auVar142._12_4_ * auVar102._12_4_;
      auVar110._0_4_ = auVar128._0_4_ * auVar142._0_4_;
      auVar110._4_4_ = auVar128._4_4_ * auVar142._4_4_;
      auVar110._8_4_ = auVar128._8_4_ * auVar142._8_4_;
      auVar110._12_4_ = auVar128._12_4_ * auVar142._12_4_;
      auVar113 = vminps_avx(auVar79,auVar110);
      auVar142 = vmaxps_avx(auVar110,auVar79);
      auVar102 = vmovshdup_avx(auVar234);
      auVar170._0_4_ = auVar69._0_4_ * auVar102._0_4_;
      auVar170._4_4_ = auVar69._4_4_ * auVar102._4_4_;
      auVar170._8_4_ = auVar69._8_4_ * auVar102._8_4_;
      auVar170._12_4_ = auVar69._12_4_ * auVar102._12_4_;
      auVar111._0_4_ = auVar98._0_4_ * auVar102._0_4_;
      auVar111._4_4_ = auVar98._4_4_ * auVar102._4_4_;
      auVar111._8_4_ = auVar98._8_4_ * auVar102._8_4_;
      auVar111._12_4_ = auVar98._12_4_ * auVar102._12_4_;
      auVar102 = vminps_avx(auVar170,auVar111);
      auVar140._0_4_ = auVar113._0_4_ + auVar102._0_4_;
      auVar140._4_4_ = auVar113._4_4_ + auVar102._4_4_;
      auVar140._8_4_ = auVar113._8_4_ + auVar102._8_4_;
      auVar140._12_4_ = auVar113._12_4_ + auVar102._12_4_;
      auVar113 = vmaxps_avx(auVar111,auVar170);
      auVar80._0_4_ = auVar142._0_4_ + auVar113._0_4_;
      auVar80._4_4_ = auVar142._4_4_ + auVar113._4_4_;
      auVar80._8_4_ = auVar142._8_4_ + auVar113._8_4_;
      auVar80._12_4_ = auVar142._12_4_ + auVar113._12_4_;
      auVar142 = vsubps_avx(auVar205,auVar80);
      auVar113 = vsubps_avx(auVar205,auVar140);
      auVar141._0_4_ = fVar212 * auVar142._0_4_;
      auVar141._4_4_ = fVar262 * auVar142._4_4_;
      auVar141._8_4_ = fVar271 * auVar142._8_4_;
      auVar141._12_4_ = fVar272 * auVar142._12_4_;
      auVar171._0_4_ = fVar212 * auVar113._0_4_;
      auVar171._4_4_ = fVar262 * auVar113._4_4_;
      auVar171._8_4_ = fVar271 * auVar113._8_4_;
      auVar171._12_4_ = fVar272 * auVar113._12_4_;
      auVar81._0_4_ = fVar158 * auVar142._0_4_;
      auVar81._4_4_ = fVar195 * auVar142._4_4_;
      auVar81._8_4_ = fVar210 * auVar142._8_4_;
      auVar81._12_4_ = fVar211 * auVar142._12_4_;
      auVar112._0_4_ = fVar158 * auVar113._0_4_;
      auVar112._4_4_ = fVar195 * auVar113._4_4_;
      auVar112._8_4_ = fVar210 * auVar113._8_4_;
      auVar112._12_4_ = fVar211 * auVar113._12_4_;
      auVar142 = vminps_avx(auVar141,auVar171);
      auVar113 = vminps_avx(auVar81,auVar112);
      auVar142 = vminps_avx(auVar142,auVar113);
      auVar113 = vmaxps_avx(auVar171,auVar141);
      auVar102 = vmaxps_avx(auVar112,auVar81);
      auVar142 = vhaddps_avx(auVar142,auVar142);
      auVar113 = vmaxps_avx(auVar102,auVar113);
      auVar113 = vhaddps_avx(auVar113,auVar113);
      auVar102 = vmovshdup_avx(auVar123);
      auVar128 = ZEXT416((uint)(auVar102._0_4_ + auVar142._0_4_));
      auVar142 = vmaxss_avx(auVar207,auVar128);
      auVar102 = ZEXT416((uint)(auVar102._0_4_ + auVar113._0_4_));
      auVar113 = vminss_avx(auVar102,auVar124);
    } while (auVar113._0_4_ < auVar142._0_4_);
    uVar58 = 0;
    if ((fVar193 < fVar157) && (fVar194 < fVar192)) {
      auVar142 = vcmpps_avx(auVar102,auVar124,1);
      auVar113 = vcmpps_avx(auVar207,auVar128,1);
      auVar142 = vandps_avx(auVar113,auVar142);
      uVar58 = auVar142._0_4_;
    }
    auVar230._8_4_ = 0x7fffffff;
    auVar230._0_8_ = 0x7fffffff7fffffff;
    auVar230._12_4_ = 0x7fffffff;
    p03.field_0.i[0] = auVar65._0_4_;
    p03.field_0.i[1] = auVar65._4_4_;
    p03.field_0.i[2] = auVar65._8_4_;
    p03.field_0.i[3] = auVar65._12_4_;
    if ((3 < (uint)uVar61 || fVar156 < 0.001) || (uVar58 & 1) != 0) {
      lVar59 = 0xc9;
      do {
        lVar59 = lVar59 + -1;
        if (lVar59 == 0) goto LAB_007a0753;
        fVar156 = auVar123._0_4_;
        fVar192 = 1.0 - fVar156;
        auVar142 = ZEXT416((uint)(fVar192 * fVar192 * fVar192));
        auVar142 = vshufps_avx(auVar142,auVar142,0);
        auVar113 = ZEXT416((uint)(fVar156 * 3.0 * fVar192 * fVar192));
        auVar113 = vshufps_avx(auVar113,auVar113,0);
        auVar102 = ZEXT416((uint)(fVar192 * fVar156 * fVar156 * 3.0));
        auVar102 = vshufps_avx(auVar102,auVar102,0);
        auVar128 = ZEXT416((uint)(fVar156 * fVar156 * fVar156));
        auVar128 = vshufps_avx(auVar128,auVar128,0);
        fVar192 = p00.field_0.v[0] * auVar142._0_4_ +
                  p01.field_0.v[0] * auVar113._0_4_ +
                  p03.field_0.v[0] * auVar128._0_4_ + p02.field_0.v[0] * auVar102._0_4_;
        fVar156 = p00.field_0.v[1] * auVar142._4_4_ +
                  p01.field_0.v[1] * auVar113._4_4_ +
                  p03.field_0.v[1] * auVar128._4_4_ + p02.field_0.v[1] * auVar102._4_4_;
        auVar82._0_8_ = CONCAT44(fVar156,fVar192);
        auVar82._8_4_ =
             p00.field_0.v[2] * auVar142._8_4_ +
             p01.field_0.v[2] * auVar113._8_4_ +
             p03.field_0.v[2] * auVar128._8_4_ + p02.field_0.v[2] * auVar102._8_4_;
        auVar82._12_4_ =
             p00.field_0.v[3] * auVar142._12_4_ +
             p01.field_0.v[3] * auVar113._12_4_ +
             p03.field_0.v[3] * auVar128._12_4_ + p02.field_0.v[3] * auVar102._12_4_;
        auVar114._8_8_ = auVar82._0_8_;
        auVar114._0_8_ = auVar82._0_8_;
        auVar113 = vshufpd_avx(auVar82,auVar82,1);
        auVar142 = vmovshdup_avx(auVar123);
        auVar113 = vsubps_avx(auVar113,auVar114);
        auVar83._0_4_ = auVar142._0_4_ * auVar113._0_4_ + fVar192;
        auVar83._4_4_ = auVar142._4_4_ * auVar113._4_4_ + fVar156;
        auVar83._8_4_ = auVar142._8_4_ * auVar113._8_4_ + fVar192;
        auVar83._12_4_ = auVar142._12_4_ * auVar113._12_4_ + fVar156;
        auVar142 = vshufps_avx(auVar83,auVar83,0);
        auVar113 = vshufps_avx(auVar83,auVar83,0x55);
        auVar115._0_4_ = auVar73._0_4_ * auVar142._0_4_ + auVar234._0_4_ * auVar113._0_4_;
        auVar115._4_4_ = auVar73._4_4_ * auVar142._4_4_ + auVar234._4_4_ * auVar113._4_4_;
        auVar115._8_4_ = auVar73._8_4_ * auVar142._8_4_ + auVar234._8_4_ * auVar113._8_4_;
        auVar115._12_4_ = auVar73._12_4_ * auVar142._12_4_ + auVar234._12_4_ * auVar113._12_4_;
        auVar123 = vsubps_avx(auVar123,auVar115);
        auVar142 = vandps_avx(auVar230,auVar83);
        auVar113 = vshufps_avx(auVar142,auVar142,0xf5);
        auVar142 = vmaxss_avx(auVar113,auVar142);
      } while (fVar145 <= auVar142._0_4_);
      fVar192 = auVar123._0_4_;
      if ((0.0 <= fVar192) && (fVar192 <= 1.0)) {
        auVar73 = vmovshdup_avx(auVar123);
        fVar156 = auVar73._0_4_;
        if ((0.0 <= fVar156) && (fVar156 <= 1.0)) {
          auVar73 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar98 = vinsertps_avx(auVar73,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
          auVar73 = vdpps_avx(auVar98,auVar97,0x7f);
          auVar234 = vdpps_avx(auVar98,auVar64,0x7f);
          auVar142 = vdpps_avx(auVar98,auVar95,0x7f);
          auVar113 = vdpps_avx(auVar98,auVar121,0x7f);
          auVar102 = vdpps_avx(auVar98,auVar122,0x7f);
          auVar128 = vdpps_avx(auVar98,auVar146,0x7f);
          auVar69 = vdpps_avx(auVar98,auVar159,0x7f);
          auVar98 = vdpps_avx(auVar98,auVar160,0x7f);
          fVar195 = 1.0 - fVar156;
          fVar210 = 1.0 - fVar192;
          fVar193 = auVar123._4_4_;
          fVar157 = auVar123._8_4_;
          fVar194 = auVar123._12_4_;
          fVar158 = fVar210 * fVar192 * fVar192 * 3.0;
          auVar223._0_4_ = fVar192 * fVar192 * fVar192;
          auVar223._4_4_ = fVar193 * fVar193 * fVar193;
          auVar223._8_4_ = fVar157 * fVar157 * fVar157;
          auVar223._12_4_ = fVar194 * fVar194 * fVar194;
          fVar157 = fVar210 * fVar210 * fVar192 * 3.0;
          fVar194 = fVar210 * fVar210 * fVar210;
          fVar193 = fVar194 * (fVar195 * auVar73._0_4_ + fVar156 * auVar102._0_4_) +
                    (fVar195 * auVar234._0_4_ + auVar128._0_4_ * fVar156) * fVar157 +
                    fVar158 * (auVar69._0_4_ * fVar156 + fVar195 * auVar142._0_4_) +
                    auVar223._0_4_ * (fVar195 * auVar113._0_4_ + fVar156 * auVar98._0_4_);
          auVar73 = ZEXT416((uint)fVar193);
          if (((fVar176 <= fVar193) &&
              (fVar195 = *(float *)(ray + k * 4 + 0x80), fVar193 <= fVar195)) &&
             (pGVar10 = (context->scene->geometries).items[uVar57].ptr,
             (pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
            local_1e8 = vshufps_avx(auVar123,auVar123,0x55);
            auVar242._8_4_ = 0x3f800000;
            auVar242._0_8_ = 0x3f8000003f800000;
            auVar242._12_4_ = 0x3f800000;
            auVar234 = vsubps_avx(auVar242,local_1e8);
            fVar211 = local_1e8._0_4_;
            fVar212 = local_1e8._4_4_;
            fVar262 = local_1e8._8_4_;
            fVar271 = local_1e8._12_4_;
            local_338 = auVar147._0_4_;
            fStack_334 = auVar147._4_4_;
            fStack_330 = auVar147._8_4_;
            fStack_32c = auVar147._12_4_;
            fVar272 = auVar234._0_4_;
            fVar273 = auVar234._4_4_;
            fVar274 = auVar234._8_4_;
            fVar279 = auVar234._12_4_;
            auVar257._0_4_ = fVar211 * auVar275._0_4_ + fVar272 * auVar120._0_4_;
            auVar257._4_4_ = fVar212 * auVar275._4_4_ + fVar273 * auVar120._4_4_;
            auVar257._8_4_ = fVar262 * auVar275._8_4_ + fVar274 * auVar120._8_4_;
            auVar257._12_4_ = fVar271 * auVar275._12_4_ + fVar279 * auVar120._12_4_;
            auVar269._0_4_ = fVar211 * auVar67._0_4_ + fVar272 * auVar254._0_4_;
            auVar269._4_4_ = fVar212 * auVar67._4_4_ + fVar273 * auVar254._4_4_;
            auVar269._8_4_ = fVar262 * auVar67._8_4_ + fVar274 * auVar254._8_4_;
            auVar269._12_4_ = fVar271 * auVar67._12_4_ + fVar279 * auVar254._12_4_;
            local_428 = auVar96._0_4_;
            fStack_424 = auVar96._4_4_;
            fStack_420 = auVar96._8_4_;
            fStack_41c = auVar96._12_4_;
            auVar278._0_4_ = fVar211 * local_338 + fVar272 * local_428;
            auVar278._4_4_ = fVar212 * fStack_334 + fVar273 * fStack_424;
            auVar278._8_4_ = fVar262 * fStack_330 + fVar274 * fStack_420;
            auVar278._12_4_ = fVar271 * fStack_32c + fVar279 * fStack_41c;
            local_408 = auVar66._0_4_;
            fStack_404 = auVar66._4_4_;
            fStack_400 = auVar66._8_4_;
            fStack_3fc = auVar66._12_4_;
            auVar243._0_4_ = fVar211 * fVar63 + fVar272 * local_408;
            auVar243._4_4_ = fVar212 * fVar92 + fVar273 * fStack_404;
            auVar243._8_4_ = fVar262 * fVar93 + fVar274 * fStack_400;
            auVar243._12_4_ = fVar271 * fVar94 + fVar279 * fStack_3fc;
            auVar102 = vsubps_avx(auVar269,auVar257);
            auVar128 = vsubps_avx(auVar278,auVar269);
            auVar69 = vsubps_avx(auVar243,auVar278);
            local_1f8 = vshufps_avx(auVar123,auVar123,0);
            fVar271 = local_1f8._0_4_;
            fVar272 = local_1f8._4_4_;
            fVar273 = local_1f8._8_4_;
            fVar274 = local_1f8._12_4_;
            auVar234 = vshufps_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),0);
            fVar210 = auVar234._0_4_;
            fVar211 = auVar234._4_4_;
            fVar212 = auVar234._8_4_;
            fVar262 = auVar234._12_4_;
            auVar234 = vshufps_avx(auVar223,auVar223,0);
            local_378 = auVar214._0_4_;
            fStack_374 = auVar214._4_4_;
            fStack_370 = auVar214._8_4_;
            fStack_36c = auVar214._12_4_;
            auVar142 = vshufps_avx(ZEXT416((uint)fVar158),ZEXT416((uint)fVar158),0);
            local_368 = auVar213._0_4_;
            fStack_364 = auVar213._4_4_;
            fStack_360 = auVar213._8_4_;
            fStack_35c = auVar213._12_4_;
            auVar113 = vshufps_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar157),0);
            local_358 = auVar197._0_4_;
            fStack_354 = auVar197._4_4_;
            fStack_350 = auVar197._8_4_;
            fStack_34c = auVar197._12_4_;
            auVar208._0_4_ =
                 (fVar210 * (fVar210 * auVar102._0_4_ + fVar271 * auVar128._0_4_) +
                 fVar271 * (fVar210 * auVar128._0_4_ + fVar271 * auVar69._0_4_)) * 3.0;
            auVar208._4_4_ =
                 (fVar211 * (fVar211 * auVar102._4_4_ + fVar272 * auVar128._4_4_) +
                 fVar272 * (fVar211 * auVar128._4_4_ + fVar272 * auVar69._4_4_)) * 3.0;
            auVar208._8_4_ =
                 (fVar212 * (fVar212 * auVar102._8_4_ + fVar273 * auVar128._8_4_) +
                 fVar273 * (fVar212 * auVar128._8_4_ + fVar273 * auVar69._8_4_)) * 3.0;
            auVar208._12_4_ =
                 (fVar262 * (fVar262 * auVar102._12_4_ + fVar274 * auVar128._12_4_) +
                 fVar274 * (fVar262 * auVar128._12_4_ + fVar274 * auVar69._12_4_)) * 3.0;
            auVar102 = vshufps_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194),0);
            local_348 = auVar196._0_4_;
            fStack_344 = auVar196._4_4_;
            fStack_340 = auVar196._8_4_;
            fStack_33c = auVar196._12_4_;
            auVar172._0_4_ =
                 auVar102._0_4_ * local_348 +
                 auVar113._0_4_ * local_358 +
                 auVar234._0_4_ * local_378 + auVar142._0_4_ * local_368;
            auVar172._4_4_ =
                 auVar102._4_4_ * fStack_344 +
                 auVar113._4_4_ * fStack_354 +
                 auVar234._4_4_ * fStack_374 + auVar142._4_4_ * fStack_364;
            auVar172._8_4_ =
                 auVar102._8_4_ * fStack_340 +
                 auVar113._8_4_ * fStack_350 +
                 auVar234._8_4_ * fStack_370 + auVar142._8_4_ * fStack_360;
            auVar172._12_4_ =
                 auVar102._12_4_ * fStack_33c +
                 auVar113._12_4_ * fStack_34c +
                 auVar234._12_4_ * fStack_36c + auVar142._12_4_ * fStack_35c;
            auVar234 = vshufps_avx(auVar208,auVar208,0xc9);
            auVar189._0_4_ = auVar172._0_4_ * auVar234._0_4_;
            auVar189._4_4_ = auVar172._4_4_ * auVar234._4_4_;
            auVar189._8_4_ = auVar172._8_4_ * auVar234._8_4_;
            auVar189._12_4_ = auVar172._12_4_ * auVar234._12_4_;
            auVar234 = vshufps_avx(auVar172,auVar172,0xc9);
            auVar173._0_4_ = auVar208._0_4_ * auVar234._0_4_;
            auVar173._4_4_ = auVar208._4_4_ * auVar234._4_4_;
            auVar173._8_4_ = auVar208._8_4_ * auVar234._8_4_;
            auVar173._12_4_ = auVar208._12_4_ * auVar234._12_4_;
            auVar234 = vsubps_avx(auVar173,auVar189);
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              *(float *)(ray + k * 4 + 0x80) = fVar193;
              uVar6 = vextractps_avx(auVar234,1);
              *(undefined4 *)(ray + k * 4 + 0xc0) = uVar6;
              uVar6 = vextractps_avx(auVar234,2);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar6;
              *(int *)(ray + k * 4 + 0xe0) = auVar234._0_4_;
              *(float *)(ray + k * 4 + 0xf0) = fVar192;
              *(float *)(ray + k * 4 + 0x100) = fVar156;
              *(uint *)(ray + k * 4 + 0x110) = uVar9;
              *(uint *)(ray + k * 4 + 0x120) = uVar57;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              auVar142 = vshufps_avx(auVar234,auVar234,0x55);
              auVar113 = vshufps_avx(auVar234,auVar234,0xaa);
              local_208 = vshufps_avx(auVar234,auVar234,0);
              local_228[0] = (RTCHitN)auVar142[0];
              local_228[1] = (RTCHitN)auVar142[1];
              local_228[2] = (RTCHitN)auVar142[2];
              local_228[3] = (RTCHitN)auVar142[3];
              local_228[4] = (RTCHitN)auVar142[4];
              local_228[5] = (RTCHitN)auVar142[5];
              local_228[6] = (RTCHitN)auVar142[6];
              local_228[7] = (RTCHitN)auVar142[7];
              local_228[8] = (RTCHitN)auVar142[8];
              local_228[9] = (RTCHitN)auVar142[9];
              local_228[10] = (RTCHitN)auVar142[10];
              local_228[0xb] = (RTCHitN)auVar142[0xb];
              local_228[0xc] = (RTCHitN)auVar142[0xc];
              local_228[0xd] = (RTCHitN)auVar142[0xd];
              local_228[0xe] = (RTCHitN)auVar142[0xe];
              local_228[0xf] = (RTCHitN)auVar142[0xf];
              local_218 = auVar113;
              local_3a8 = auVar201._0_8_;
              uStack_3a0 = auVar201._8_8_;
              local_1d8 = local_3a8;
              uStack_1d0 = uStack_3a0;
              local_1c8 = auVar219;
              vcmpps_avx(ZEXT1632(auVar219),ZEXT1632(auVar219),0xf);
              uStack_1b4 = context->user->instID[0];
              local_1b8 = uStack_1b4;
              uStack_1b0 = uStack_1b4;
              uStack_1ac = uStack_1b4;
              uStack_1a8 = context->user->instPrimID[0];
              uStack_1a4 = uStack_1a8;
              uStack_1a0 = uStack_1a8;
              uStack_19c = uStack_1a8;
              *(float *)(ray + k * 4 + 0x80) = fVar193;
              local_488 = *local_470;
              args.valid = (int *)local_488;
              args.geometryUserPtr = pGVar10->userPtr;
              args.context = context->user;
              args.hit = local_228;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar10->intersectionFilterN)(&args);
                auVar300._8_56_ = extraout_var;
                auVar300._0_8_ = extraout_XMM1_Qa;
                auVar73 = auVar300._0_16_;
              }
              if (local_488 == (undefined1  [16])0x0) {
                auVar234 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar73 = vpcmpeqd_avx(auVar73,auVar73);
                auVar234 = auVar234 ^ auVar73;
              }
              else {
                p_Var11 = context->args->filter;
                auVar73 = vpcmpeqd_avx(auVar113,auVar113);
                if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var11)(&args);
                  auVar73 = vpcmpeqd_avx(auVar73,auVar73);
                }
                auVar142 = vpcmpeqd_avx(local_488,_DAT_01f45a50);
                auVar234 = auVar142 ^ auVar73;
                if (local_488 != (undefined1  [16])0x0) {
                  auVar142 = auVar142 ^ auVar73;
                  auVar73 = vmaskmovps_avx(auVar142,*(undefined1 (*) [16])args.hit);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar73;
                  auVar73 = vmaskmovps_avx(auVar142,*(undefined1 (*) [16])(args.hit + 0x10));
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar73;
                  auVar73 = vmaskmovps_avx(auVar142,*(undefined1 (*) [16])(args.hit + 0x20));
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar73;
                  auVar73 = vmaskmovps_avx(auVar142,*(undefined1 (*) [16])(args.hit + 0x30));
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar73;
                  auVar73 = vmaskmovps_avx(auVar142,*(undefined1 (*) [16])(args.hit + 0x40));
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar73;
                  auVar73 = vmaskmovps_avx(auVar142,*(undefined1 (*) [16])(args.hit + 0x50));
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar73;
                  auVar73 = vmaskmovps_avx(auVar142,*(undefined1 (*) [16])(args.hit + 0x60));
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar73;
                  auVar73 = vmaskmovps_avx(auVar142,*(undefined1 (*) [16])(args.hit + 0x70));
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar73;
                  auVar73 = vmaskmovps_avx(auVar142,*(undefined1 (*) [16])(args.hit + 0x80));
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar73;
                }
              }
              auVar84._8_8_ = 0x100000001;
              auVar84._0_8_ = 0x100000001;
              if ((auVar84 & auVar234) == (undefined1  [16])0x0) {
                *(float *)(ray + k * 4 + 0x80) = fVar195;
              }
            }
          }
        }
      }
      goto LAB_007a0753;
    }
    auVar73 = vinsertps_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar192),0x10);
    auVar307 = ZEXT1664(auVar73);
    auVar300 = ZEXT1664(auVar207);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }